

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O1

void iterator_seek_wal_only_test(void)

{
  fdb_encryption_key *pfVar1;
  fdb_status fVar2;
  fdb_kvs_handle *pfVar4;
  size_t sVar5;
  int iVar3;
  fdb_iterator **ppfVar6;
  size_t sVar7;
  size_t sVar8;
  fdb_file_handle **ptr_fhandle;
  btree *ptr_fhandle_00;
  fdb_kvs_handle *pfVar9;
  fdb_kvs_handle *pfVar10;
  ulong uVar11;
  long lVar12;
  fdb_kvs_handle **ptr_iterator;
  fdb_config **ptr_iterator_00;
  fdb_kvs_handle **ppfVar13;
  fdb_config *pfVar14;
  uint uVar15;
  int delete_opt;
  fdb_kvs_handle **unaff_RBP;
  fdb_kvs_handle *pfVar16;
  fdb_doc **doc;
  char *pcVar17;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 unaff_R12;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar18;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar19;
  size_t unaff_R13;
  fdb_kvs_handle *pfVar20;
  fdb_config *pfVar21;
  char *doc_00;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv1;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char keybuf [256];
  char bodybuf [256];
  char metabuf [256];
  fdb_config fconfig;
  fdb_iterator *pfStack_4198;
  fdb_kvs_handle *pfStack_4190;
  fdb_file_handle *pfStack_4188;
  fdb_doc *pfStack_4180;
  fdb_kvs_config fStack_4178;
  timeval tStack_4160;
  fdb_config fStack_4150;
  fdb_config *pfStack_4058;
  fdb_iterator *pfStack_4040;
  fdb_kvs_handle *pfStack_4038;
  fdb_doc *pfStack_4030;
  fdb_file_handle *pfStack_4028;
  fdb_kvs_config fStack_4020;
  timeval tStack_4008;
  fdb_config fStack_3ff8;
  fdb_config *pfStack_3f00;
  fdb_iterator *pfStack_3ee8;
  fdb_kvs_handle *pfStack_3ee0;
  fdb_file_handle *pfStack_3ed8;
  fdb_doc *pfStack_3ed0;
  uint64_t uStack_3ec8;
  undefined1 uStack_3ec0;
  undefined7 uStack_3eb8;
  undefined4 uStack_3eb1;
  undefined8 uStack_3ea8;
  undefined7 uStack_3ea0;
  undefined4 uStack_3e99;
  fdb_kvs_config fStack_3e90;
  timeval tStack_3e78;
  undefined4 uStack_3e68;
  undefined1 uStack_3e64;
  fdb_config fStack_3d60;
  char acStack_3c68 [256];
  fdb_config *pfStack_3b68;
  char *pcStack_3b60;
  code *pcStack_3b58;
  fdb_doc *pfStack_3b40;
  fdb_iterator *pfStack_3b38;
  fdb_kvs_handle *pfStack_3b30;
  fdb_file_handle *pfStack_3b28;
  fdb_kvs_config fStack_3b20;
  timeval tStack_3b08;
  fdb_config fStack_3af8;
  fdb_iterator **ppfStack_3a00;
  fdb_iterator *pfStack_39e8;
  fdb_doc *pfStack_39e0;
  fdb_kvs_handle *pfStack_39d8;
  fdb_file_handle *pfStack_39d0;
  timeval tStack_39c8;
  fdb_iterator *apfStack_39b8 [33];
  fdb_kvs_config fStack_38b0;
  char acStack_3898 [264];
  fdb_config fStack_3790;
  char acStack_3698 [256];
  fdb_kvs_handle *pfStack_3598;
  fdb_kvs_handle *pfStack_3590;
  fdb_doc **ppfStack_3588;
  fdb_doc **ppfStack_3580;
  fdb_doc **ppfStack_3578;
  fdb_kvs_handle *pfStack_3560;
  fdb_file_handle *pfStack_3558;
  fdb_iterator *pfStack_3550;
  fdb_doc *pfStack_3548;
  fdb_kvs_handle *pfStack_3540;
  fdb_kvs_config fStack_3538;
  timeval tStack_3520;
  fdb_doc *apfStack_3510 [32];
  undefined1 auStack_3410 [272];
  uint8_t auStack_3300 [20];
  undefined4 uStack_32ec;
  undefined4 uStack_32e4;
  undefined1 uStack_32da;
  fdb_doc *apfStack_3210 [500];
  fdb_kvs_handle afStack_2270 [7];
  fdb_kvs_handle **ppfStack_12c8;
  fdb_kvs_handle *pfStack_12c0;
  fdb_doc **ppfStack_12b0;
  fdb_doc **ppfStack_12a8;
  fdb_doc **ppfStack_12a0;
  fdb_kvs_handle *pfStack_1290;
  fdb_iterator *pfStack_1288;
  fdb_iterator *pfStack_1280;
  fdb_kvs_handle *pfStack_1278;
  fdb_file_handle *pfStack_1270;
  fdb_doc *pfStack_1268;
  fdb_file_handle *pfStack_1260;
  undefined1 auStack_1258 [56];
  fdb_config fStack_1220;
  fdb_doc *apfStack_1128 [65];
  fdb_config **ppfStack_f20;
  btree *pbStack_f18;
  fdb_kvs_handle **ppfStack_f10;
  fdb_config *pfStack_f08;
  fdb_file_handle **ppfStack_f00;
  fdb_kvs_handle *pfStack_ef8;
  fdb_config *pfStack_ee8;
  fdb_config *pfStack_ee0;
  fdb_kvs_handle *pfStack_ed8;
  fdb_file_handle *pfStack_ed0;
  fdb_kvs_config fStack_ec8;
  fdb_doc *apfStack_eb0 [5];
  fdb_kvs_handle *apfStack_e88 [5];
  timeval tStack_e60;
  fdb_kvs_handle fStack_e50;
  fdb_config fStack_b50;
  fdb_kvs_handle **ppfStack_a58;
  btree *pbStack_a50;
  fdb_kvs_handle **ppfStack_a48;
  undefined8 *puStack_a40;
  undefined7 *puStack_a38;
  fdb_kvs_handle *pfStack_a30;
  fdb_kvs_handle *pfStack_a20;
  fdb_kvs_handle *pfStack_a18;
  fdb_kvs_handle *pfStack_a10;
  undefined7 uStack_a08;
  undefined4 uStack_a01;
  fdb_kvs_handle *pfStack_9f8;
  fdb_file_handle *pfStack_9f0;
  undefined1 auStack_9e8 [16];
  undefined7 uStack_9d8;
  undefined1 uStack_9d1;
  undefined7 uStack_9d0;
  undefined8 uStack_9c8;
  void *pvStack_9c0;
  undefined1 uStack_9b8;
  timeval tStack_9b0;
  undefined1 auStack_9a0 [40];
  fdb_file_handle *pfStack_978;
  undefined4 uStack_964;
  fdb_iterator **ppfStack_890;
  char *pcStack_888;
  fdb_kvs_handle *pfStack_880;
  char *pcStack_878;
  char *pcStack_870;
  code *pcStack_868;
  fdb_iterator *pfStack_858;
  fdb_iterator *pfStack_850;
  fdb_kvs_handle *pfStack_848;
  fdb_kvs_handle *pfStack_840;
  fdb_file_handle *pfStack_838;
  timeval tStack_830;
  fdb_kvs_config fStack_820;
  fdb_config fStack_808;
  char acStack_710 [256];
  char acStack_610 [264];
  fdb_kvs_handle *pfStack_508;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_500;
  size_t sStack_4f8;
  fdb_kvs_handle *pfStack_4f0;
  fdb_kvs_handle *pfStack_4e8;
  fdb_kvs_handle **ppfStack_4e0;
  undefined1 local_4d0 [16];
  fdb_kvs_handle *local_4c0;
  fdb_file_handle *local_4b8;
  fdb_kvs_handle *local_4b0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 local_4a8 [11];
  undefined1 local_450 [40];
  fdb_kvs_handle local_428;
  fdb_config local_128;
  
  ppfStack_4e0 = (fdb_kvs_handle **)0x11966c;
  gettimeofday((timeval *)(local_450 + 0x18),(__timezone_ptr_t)0x0);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119671;
  memleak_start();
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119682;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_4e0 = (fdb_kvs_handle **)0x119692;
  fdb_get_default_config();
  pfVar4 = (fdb_kvs_handle *)local_450;
  ppfStack_4e0 = (fdb_kvs_handle **)0x1196a2;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  pfVar16 = (fdb_kvs_handle *)&local_4b8;
  ppfStack_4e0 = (fdb_kvs_handle **)0x1196d0;
  fdb_open((fdb_file_handle **)pfVar16,"./iterator_test1",&local_128);
  pfVar9 = (fdb_kvs_handle *)&local_4c0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x1196e3;
  fdb_kvs_open_default(local_4b8,(fdb_kvs_handle **)pfVar9,(fdb_kvs_config *)pfVar4);
  ppfStack_4e0 = (fdb_kvs_handle **)0x1196f9;
  fVar2 = fdb_set_log_callback(local_4c0,logCallbackFunc,"iterator_seek_wal_only_test");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a27d;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11971f;
  fVar2 = fdb_kvs_open(local_4b8,&local_4b0,"kv1",(fdb_kvs_config *)local_450);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a282;
  unaff_R12.end_seqnum = 0;
  pfVar10 = (fdb_kvs_handle *)0x0;
  do {
    ppfStack_4e0 = (fdb_kvs_handle **)0x119747;
    sprintf((char *)&local_428,"kEy%d",(ulong)pfVar10 & 0xffffffff);
    ppfStack_4e0 = (fdb_kvs_handle **)0x11975f;
    sprintf((char *)&local_428.bub_ctx.handle,"mEta%d",(ulong)pfVar10 & 0xffffffff);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119777;
    sprintf((char *)&local_428.config.encryption_key,"bOdy%d",(ulong)pfVar10 & 0xffffffff);
    pfVar16 = (fdb_kvs_handle *)((long)local_4a8 + unaff_R12.end_seqnum);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119787;
    unaff_R13 = strlen((char *)&local_428);
    unaff_RBP = &local_428.bub_ctx.handle;
    ppfStack_4e0 = (fdb_kvs_handle **)0x11979a;
    pfVar4 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
    ppfStack_4e0 = (fdb_kvs_handle **)0x1197aa;
    sVar5 = strlen((char *)&local_428.config.encryption_key);
    ppfStack_4e0 = (fdb_kvs_handle **)0x1197cf;
    fdb_doc_create((fdb_doc **)pfVar16,&local_428,unaff_R13,unaff_RBP,(size_t)pfVar4,
                   &local_428.config.encryption_key,sVar5);
    ppfStack_4e0 = (fdb_kvs_handle **)0x1197de;
    fVar2 = fdb_set(local_4b0,(fdb_doc *)local_4a8[(long)pfVar10]);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      ppfStack_4e0 = (fdb_kvs_handle **)0x11a231;
      iterator_seek_wal_only_test();
      goto LAB_0011a231;
    }
    ppfStack_4e0 = (fdb_kvs_handle **)0x1197f0;
    fdb_doc_free((fdb_doc *)local_4a8[(long)pfVar10]);
    pfVar10 = (fdb_kvs_handle *)&(pfVar10->kvs_config).field_0x1;
    unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
  } while (pfVar10 != (fdb_kvs_handle *)0xa);
  unaff_R12.end_seqnum = 0;
  uVar11 = 0;
  do {
    ppfStack_4e0 = (fdb_kvs_handle **)0x119821;
    sprintf((char *)&local_428,"key%d",uVar11 & 0xffffffff);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119839;
    sprintf((char *)&local_428.bub_ctx.handle,"meta%d",uVar11 & 0xffffffff);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119851;
    sprintf((char *)&local_428.config.encryption_key,"body%d",uVar11 & 0xffffffff);
    pfVar16 = (fdb_kvs_handle *)((long)local_4a8 + unaff_R12.end_seqnum);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119861;
    unaff_R13 = strlen((char *)&local_428);
    unaff_RBP = &local_428.bub_ctx.handle;
    ppfStack_4e0 = (fdb_kvs_handle **)0x119874;
    pfVar4 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119884;
    sVar5 = strlen((char *)&local_428.config.encryption_key);
    ppfStack_4e0 = (fdb_kvs_handle **)0x1198a9;
    fdb_doc_create((fdb_doc **)pfVar16,&local_428,unaff_R13,unaff_RBP,(size_t)pfVar4,
                   &local_428.config.encryption_key,sVar5);
    ppfStack_4e0 = (fdb_kvs_handle **)0x1198b8;
    fdb_set(local_4c0,(fdb_doc *)local_4a8[uVar11]);
    uVar11 = uVar11 + 1;
    unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
  } while (uVar11 != 10);
  ppfStack_4e0 = (fdb_kvs_handle **)0x1198d5;
  fdb_commit(local_4b8,'\0');
  ppfStack_4e0 = (fdb_kvs_handle **)0x1198f8;
  fdb_iterator_init(local_4c0,(fdb_iterator **)(local_4d0 + 8),(void *)0x0,0,(void *)0x0,0,0);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119905;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  aVar18 = local_4a8[0];
  pfVar10 = (fdb_kvs_handle *)local_4d0._0_8_;
  pfVar9 = (fdb_kvs_handle *)(local_4d0 + 8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a287;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[0].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11992e;
  iVar3 = bcmp(pfVar4,pfVar16,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  if (iVar3 != 0) goto LAB_0011a28c;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar10 + 0x38);
  pfVar16 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(aVar18.end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11994e;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar10->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a297;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar10 + 0x40))->seqtree;
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(aVar18.end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11996e;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar10->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a2a2;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11997e;
  fdb_doc_free((fdb_doc *)pfVar10);
  pfVar10 = (fdb_kvs_handle *)local_4d0._8_8_;
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  pfVar4 = (fdb_kvs_handle *)
           (((atomic<unsigned_long> *)(local_4a8[2].end_seqnum + 0x20))->
           super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x1199a2;
  sVar5 = strlen((char *)&local_428);
  ppfStack_4e0 = (fdb_kvs_handle **)0x1199b2;
  fVar2 = fdb_iterator_seek((fdb_iterator *)pfVar10,pfVar4,sVar5,'\0');
  if (fVar2 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a2ad;
  ppfStack_4e0 = (fdb_kvs_handle **)0x1199ca;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  aVar19 = local_4a8[2];
  pfVar9 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a2b2;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[2].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x1199f3;
  iVar3 = bcmp(pfVar4,pfVar16,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  if (iVar3 != 0) goto LAB_0011a2b7;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar9 + 0x38);
  pfVar16 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(aVar19.end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119a13;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar9->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a2c2;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar9 + 0x40))->seqtree;
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(aVar19.end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119a33;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar9->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a2cd;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119a43;
  fdb_doc_free((fdb_doc *)pfVar9);
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119a56;
  fVar2 = fdb_iterator_next((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a2d8;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119a6e;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  aVar18 = local_4a8[3];
  pfVar10 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a2dd;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[3].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119a97;
  iVar3 = bcmp(pfVar4,pfVar16,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  if (iVar3 != 0) goto LAB_0011a2e2;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar10 + 0x38);
  pfVar16 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(aVar18.end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119ab7;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar10->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a2ed;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar10 + 0x40))->seqtree;
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(aVar18.end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119ad7;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar10->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a2f8;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119ae7;
  fdb_doc_free((fdb_doc *)pfVar10);
  pfVar10 = (fdb_kvs_handle *)local_4d0._8_8_;
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  pfVar4 = (fdb_kvs_handle *)
           (((atomic<unsigned_long> *)(local_4a8[9].end_seqnum + 0x20))->
           super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119b0b;
  sVar5 = strlen((char *)&local_428);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119b1b;
  fVar2 = fdb_iterator_seek((fdb_iterator *)pfVar10,pfVar4,sVar5,'\0');
  if (fVar2 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a303;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119b33;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  aVar19 = local_4a8[9];
  pfVar9 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a308;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[9].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119b5c;
  iVar3 = bcmp(pfVar4,pfVar16,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  if (iVar3 != 0) goto LAB_0011a30d;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar9 + 0x38);
  pfVar16 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(aVar19.end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119b7c;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar9->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a318;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar9 + 0x40))->seqtree;
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(aVar19.end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119b9c;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar9->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a323;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119bac;
  fdb_doc_free((fdb_doc *)pfVar9);
  pfVar9 = (fdb_kvs_handle *)local_4d0._8_8_;
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  pfVar4 = (fdb_kvs_handle *)
           (((atomic<unsigned_long> *)(local_4a8[0].end_seqnum + 0x20))->
           super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119bd0;
  sVar5 = strlen((char *)&local_428);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119be0;
  fVar2 = fdb_iterator_seek((fdb_iterator *)pfVar9,pfVar4,sVar5,'\0');
  if (fVar2 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a32e;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119bf8;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  unaff_R12 = local_4a8[0];
  pfVar10 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a333;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[0].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119c21;
  iVar3 = bcmp(pfVar4,pfVar16,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  if (iVar3 != 0) goto LAB_0011a338;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar10 + 0x38);
  pfVar16 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(unaff_R12.end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119c41;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar10->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a343;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar10 + 0x40))->seqtree;
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(unaff_R12.end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119c61;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar10->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a34e;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119c71;
  fdb_doc_free((fdb_doc *)pfVar10);
  pfVar10 = (fdb_kvs_handle *)local_4d0._8_8_;
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  pfVar4 = (fdb_kvs_handle *)
           (((atomic<unsigned_long> *)(local_4a8[2].end_seqnum + 0x20))->
           super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119c95;
  sVar5 = strlen((char *)&local_428);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119ca5;
  fVar2 = fdb_iterator_seek((fdb_iterator *)pfVar10,pfVar4,sVar5,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a359;
  unaff_R13 = 2;
  pfVar10 = (fdb_kvs_handle *)local_4d0;
  pfVar20 = pfVar4;
  do {
    ppfStack_4e0 = (fdb_kvs_handle **)0x119cc5;
    fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)pfVar10);
    pfVar4 = (fdb_kvs_handle *)local_4d0._0_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a23c;
    pfVar16 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
    unaff_RBP = (fdb_kvs_handle **)local_4a8[unaff_R13].end_seqnum;
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 4);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119ced;
    iVar3 = bcmp(pfVar16,(void *)unaff_R12,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
    if (iVar3 != 0) goto LAB_0011a231;
    pfVar16 = *(fdb_kvs_handle **)((long)pfVar4 + 0x38);
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 7);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119d0c;
    iVar3 = bcmp(pfVar16,(void *)unaff_R12,(size_t)(pfVar4->kvs_config).custom_cmp);
    pfVar9 = pfVar10;
    if (iVar3 != 0) goto LAB_0011a24c;
    pfVar16 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar4 + 0x40))->seqtree;
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 8);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119d2b;
    iVar3 = bcmp(pfVar16,(void *)unaff_R12,(size_t)(pfVar4->kvs_config).custom_cmp_param);
    if (iVar3 != 0) goto LAB_0011a241;
    ppfStack_4e0 = (fdb_kvs_handle **)0x119d3b;
    fdb_doc_free((fdb_doc *)pfVar4);
    local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
    unaff_R13 = unaff_R13 + 1;
    ppfStack_4e0 = (fdb_kvs_handle **)0x119d51;
    fVar2 = fdb_iterator_next((fdb_iterator *)local_4d0._8_8_);
    pfVar9 = (fdb_kvs_handle *)local_4d0._8_8_;
    pfVar20 = pfVar4;
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  if (unaff_R13 != 10) goto LAB_0011a35e;
  pfVar4 = (fdb_kvs_handle *)
           (((atomic<unsigned_long> *)(local_4a8[3].end_seqnum + 0x20))->
           super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119d7f;
  sVar5 = strlen((char *)&local_428);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119d8f;
  fVar2 = fdb_iterator_seek((fdb_iterator *)pfVar9,pfVar4,sVar5,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a363;
  unaff_R13 = 3;
  pfVar9 = (fdb_kvs_handle *)local_4d0;
  pfVar10 = pfVar4;
  do {
    ppfStack_4e0 = (fdb_kvs_handle **)0x119daf;
    fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)pfVar9);
    pfVar4 = (fdb_kvs_handle *)local_4d0._0_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a262;
    pfVar16 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
    unaff_RBP = (fdb_kvs_handle **)local_4a8[unaff_R13].end_seqnum;
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 4);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119dd7;
    iVar3 = bcmp(pfVar16,(void *)unaff_R12,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
    if (iVar3 != 0) goto LAB_0011a257;
    pfVar16 = *(fdb_kvs_handle **)((long)pfVar4 + 0x38);
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 7);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119df6;
    iVar3 = bcmp(pfVar16,(void *)unaff_R12,(size_t)(pfVar4->kvs_config).custom_cmp);
    if (iVar3 != 0) goto LAB_0011a272;
    pfVar16 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar4 + 0x40))->seqtree;
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 8);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119e15;
    iVar3 = bcmp(pfVar16,(void *)unaff_R12,(size_t)(pfVar4->kvs_config).custom_cmp_param);
    if (iVar3 != 0) goto LAB_0011a267;
    ppfStack_4e0 = (fdb_kvs_handle **)0x119e25;
    fdb_doc_free((fdb_doc *)pfVar4);
    local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
    unaff_R13 = unaff_R13 + 1;
    ppfStack_4e0 = (fdb_kvs_handle **)0x119e3b;
    fVar2 = fdb_iterator_next((fdb_iterator *)local_4d0._8_8_);
    pfVar10 = pfVar4;
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  if (unaff_R13 != 10) goto LAB_0011a368;
  pfVar9 = (fdb_kvs_handle *)(local_4d0 + 8);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119e5b;
  fdb_iterator_close((fdb_iterator *)local_4d0._8_8_);
  pfVar4 = &local_428;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119e7c;
  sprintf((char *)pfVar4,"key%d",4);
  unaff_R12.end_seqnum = (fdb_seqnum_t)&local_428.bub_ctx.handle;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119e96;
  sprintf((char *)unaff_R12,"key%d",8);
  pfVar16 = local_4c0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119ea3;
  unaff_R13 = strlen((char *)pfVar4);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119eae;
  sVar5 = strlen((char *)unaff_R12);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119ecc;
  fVar2 = fdb_iterator_init(pfVar16,(fdb_iterator **)pfVar9,pfVar4,unaff_R13,(void *)unaff_R12,sVar5
                            ,2);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a36d;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119ede;
  fVar2 = fdb_iterator_seek_to_max((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a372;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119ef5;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  pfVar10 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a377;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[8].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119f1e;
  iVar3 = bcmp(pfVar4,pfVar16,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  unaff_R12 = local_4a8[8];
  if (iVar3 != 0) goto LAB_0011a37c;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar10 + 0x38);
  pfVar16 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(local_4a8[8].end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119f3e;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar10->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a387;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar10 + 0x40))->seqtree;
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[8].end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119f5e;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar10->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a392;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119f6e;
  fdb_doc_free((fdb_doc *)pfVar10);
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119f81;
  fVar2 = fdb_iterator_seek_to_min((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a39d;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119f98;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  pfVar9 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a3a2;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[4].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119fc1;
  iVar3 = bcmp(pfVar4,pfVar16,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  unaff_R12 = local_4a8[4];
  if (iVar3 != 0) goto LAB_0011a3a7;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar9 + 0x38);
  pfVar16 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(local_4a8[4].end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119fe1;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar9->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a3b2;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar9 + 0x40))->seqtree;
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[4].end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a001;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar9->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a3bd;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a011;
  fdb_doc_free((fdb_doc *)pfVar9);
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a024;
  fVar2 = fdb_iterator_close((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a3c8;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a04c;
  fVar2 = fdb_iterator_init(local_4c0,(fdb_iterator **)(local_4d0 + 8),(void *)0x0,0,(void *)0x0,0,0
                           );
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a3cd;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a05e;
  fVar2 = fdb_iterator_seek_to_max((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a3d2;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a075;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  pfVar10 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a3d7;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[9].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a09e;
  iVar3 = bcmp(pfVar4,pfVar16,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  unaff_R12 = local_4a8[9];
  if (iVar3 != 0) goto LAB_0011a3dc;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar10 + 0x38);
  pfVar16 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(local_4a8[9].end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a0be;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar10->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a3e7;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar10 + 0x40))->seqtree;
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[9].end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a0de;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar10->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a3f2;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a0ee;
  fdb_doc_free((fdb_doc *)pfVar10);
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a101;
  fVar2 = fdb_iterator_seek_to_min((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a3fd;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a118;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  pfVar9 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a402;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[0].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a141;
  iVar3 = bcmp(pfVar4,pfVar16,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  unaff_R12 = local_4a8[0];
  if (iVar3 != 0) goto LAB_0011a407;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar9 + 0x38);
  pfVar16 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(local_4a8[0].end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a161;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar9->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a412;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar9 + 0x40))->seqtree;
  pfVar16 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[0].end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a181;
  iVar3 = bcmp(pfVar4,pfVar16,(size_t)(pfVar9->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a41d;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a191;
  fdb_doc_free((fdb_doc *)pfVar9);
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a1a4;
  fVar2 = fdb_iterator_close((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    ppfStack_4e0 = (fdb_kvs_handle **)0x11a1b6;
    fdb_kvs_close(local_4b0);
    ppfStack_4e0 = (fdb_kvs_handle **)0x11a1c0;
    fdb_kvs_close(local_4c0);
    ppfStack_4e0 = (fdb_kvs_handle **)0x11a1ca;
    fdb_close(local_4b8);
    lVar12 = 0;
    do {
      ppfStack_4e0 = (fdb_kvs_handle **)0x11a1d6;
      fdb_doc_free((fdb_doc *)local_4a8[lVar12]);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    ppfStack_4e0 = (fdb_kvs_handle **)0x11a1e4;
    fdb_shutdown();
    ppfStack_4e0 = (fdb_kvs_handle **)0x11a1e9;
    memleak_end();
    pcVar17 = "%s PASSED\n";
    if (iterator_seek_wal_only_test()::__test_pass != '\0') {
      pcVar17 = "%s FAILED\n";
    }
    ppfStack_4e0 = (fdb_kvs_handle **)0x11a21a;
    fprintf(_stderr,pcVar17,"iterator seek wal only test");
    return;
  }
  goto LAB_0011a428;
LAB_0011a6be:
  pcStack_868 = (code *)0x11a6c3;
  iterator_after_wal_threshold();
  goto LAB_0011a6c3;
LAB_0011ab69:
  pfStack_a30 = (fdb_kvs_handle *)0x11ab6e;
  iterator_manual_wal_flush();
LAB_0011ab6e:
  ptr_iterator = &pfStack_a18;
  pfStack_a30 = (fdb_kvs_handle *)0x11ab73;
  iterator_manual_wal_flush();
  goto LAB_0011ab73;
LAB_0011b161:
  pfStack_ef8 = (fdb_kvs_handle *)0x11b16c;
  sequence_iterator_seek_test();
  pfVar21 = pfVar14;
LAB_0011b16c:
  pfVar14 = pfVar21;
  pfStack_ef8 = (fdb_kvs_handle *)0x11b171;
  sequence_iterator_seek_test();
LAB_0011b171:
  pfStack_ef8 = (fdb_kvs_handle *)0x11b17c;
  sequence_iterator_seek_test();
LAB_0011b17c:
  pfStack_ef8 = (fdb_kvs_handle *)0x11b187;
  sequence_iterator_seek_test();
LAB_0011b187:
  pfStack_ef8 = (fdb_kvs_handle *)0x11b192;
  sequence_iterator_seek_test();
  pfVar21 = pfVar14;
  goto LAB_0011b192;
LAB_0011b4b1:
  ppfVar13 = &pfStack_1290;
  ppfStack_12a0 = (fdb_doc **)0x11b4b6;
  iterator_concurrent_compaction();
  goto LAB_0011b4b6;
LAB_0011b9d5:
  ppfStack_3578 = (fdb_doc **)0x11b9da;
  iterator_offset_access_test();
LAB_0011b9da:
  ppfStack_3578 = (fdb_doc **)0x11b9df;
  iterator_offset_access_test();
LAB_0011b9df:
  ppfStack_3578 = (fdb_doc **)0x11b9e4;
  iterator_offset_access_test();
LAB_0011b9e4:
  ppfStack_3578 = (fdb_doc **)0x11b9e9;
  iterator_offset_access_test();
LAB_0011b9e9:
  ppfStack_3578 = (fdb_doc **)0x11b9ee;
  iterator_offset_access_test();
LAB_0011b9ee:
  ppfStack_3578 = (fdb_doc **)0x11b9f3;
  iterator_offset_access_test();
LAB_0011b9f3:
  ppfStack_3578 = (fdb_doc **)0x11b9f8;
  iterator_offset_access_test();
  goto LAB_0011b9f8;
LAB_0011a231:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a23c;
  iterator_seek_wal_only_test();
  pfVar20 = pfVar4;
LAB_0011a23c:
  pfVar4 = pfVar20;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a241;
  iterator_seek_wal_only_test();
  pfVar9 = pfVar10;
LAB_0011a241:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a24c;
  iterator_seek_wal_only_test();
LAB_0011a24c:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a257;
  iterator_seek_wal_only_test();
LAB_0011a257:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a262;
  iterator_seek_wal_only_test();
  pfVar10 = pfVar4;
LAB_0011a262:
  pfVar4 = pfVar10;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a267;
  iterator_seek_wal_only_test();
LAB_0011a267:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a272;
  iterator_seek_wal_only_test();
LAB_0011a272:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a27d;
  iterator_seek_wal_only_test();
LAB_0011a27d:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a282;
  iterator_seek_wal_only_test();
LAB_0011a282:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a287;
  iterator_seek_wal_only_test();
LAB_0011a287:
  aVar18 = unaff_R12;
  pfVar10 = pfVar9;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a28c;
  iterator_seek_wal_only_test();
LAB_0011a28c:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a297;
  iterator_seek_wal_only_test();
LAB_0011a297:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2a2;
  iterator_seek_wal_only_test();
LAB_0011a2a2:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2ad;
  iterator_seek_wal_only_test();
LAB_0011a2ad:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2b2;
  iterator_seek_wal_only_test();
LAB_0011a2b2:
  aVar19 = aVar18;
  pfVar9 = pfVar10;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2b7;
  iterator_seek_wal_only_test();
LAB_0011a2b7:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2c2;
  iterator_seek_wal_only_test();
LAB_0011a2c2:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2cd;
  iterator_seek_wal_only_test();
LAB_0011a2cd:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2d8;
  iterator_seek_wal_only_test();
LAB_0011a2d8:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2dd;
  iterator_seek_wal_only_test();
LAB_0011a2dd:
  aVar18 = aVar19;
  pfVar10 = pfVar9;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2e2;
  iterator_seek_wal_only_test();
LAB_0011a2e2:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2ed;
  iterator_seek_wal_only_test();
LAB_0011a2ed:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2f8;
  iterator_seek_wal_only_test();
LAB_0011a2f8:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a303;
  iterator_seek_wal_only_test();
LAB_0011a303:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a308;
  iterator_seek_wal_only_test();
LAB_0011a308:
  aVar19 = aVar18;
  pfVar9 = pfVar10;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a30d;
  iterator_seek_wal_only_test();
LAB_0011a30d:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a318;
  iterator_seek_wal_only_test();
LAB_0011a318:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a323;
  iterator_seek_wal_only_test();
LAB_0011a323:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a32e;
  iterator_seek_wal_only_test();
LAB_0011a32e:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a333;
  iterator_seek_wal_only_test();
LAB_0011a333:
  unaff_R12 = aVar19;
  pfVar10 = pfVar9;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a338;
  iterator_seek_wal_only_test();
LAB_0011a338:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a343;
  iterator_seek_wal_only_test();
LAB_0011a343:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a34e;
  iterator_seek_wal_only_test();
LAB_0011a34e:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a359;
  iterator_seek_wal_only_test();
LAB_0011a359:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a35e;
  iterator_seek_wal_only_test();
LAB_0011a35e:
  pfVar9 = pfVar10;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a363;
  iterator_seek_wal_only_test();
LAB_0011a363:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a368;
  iterator_seek_wal_only_test();
LAB_0011a368:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a36d;
  iterator_seek_wal_only_test();
LAB_0011a36d:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a372;
  iterator_seek_wal_only_test();
LAB_0011a372:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a377;
  iterator_seek_wal_only_test();
LAB_0011a377:
  pfVar10 = pfVar9;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a37c;
  iterator_seek_wal_only_test();
LAB_0011a37c:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a387;
  iterator_seek_wal_only_test();
LAB_0011a387:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a392;
  iterator_seek_wal_only_test();
LAB_0011a392:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a39d;
  iterator_seek_wal_only_test();
LAB_0011a39d:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3a2;
  iterator_seek_wal_only_test();
LAB_0011a3a2:
  pfVar9 = pfVar10;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3a7;
  iterator_seek_wal_only_test();
LAB_0011a3a7:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3b2;
  iterator_seek_wal_only_test();
LAB_0011a3b2:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3bd;
  iterator_seek_wal_only_test();
LAB_0011a3bd:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3c8;
  iterator_seek_wal_only_test();
LAB_0011a3c8:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3cd;
  iterator_seek_wal_only_test();
LAB_0011a3cd:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3d2;
  iterator_seek_wal_only_test();
LAB_0011a3d2:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3d7;
  iterator_seek_wal_only_test();
LAB_0011a3d7:
  pfVar10 = pfVar9;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3dc;
  iterator_seek_wal_only_test();
LAB_0011a3dc:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3e7;
  iterator_seek_wal_only_test();
LAB_0011a3e7:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3f2;
  iterator_seek_wal_only_test();
LAB_0011a3f2:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3fd;
  iterator_seek_wal_only_test();
LAB_0011a3fd:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a402;
  iterator_seek_wal_only_test();
LAB_0011a402:
  pfVar9 = pfVar10;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a407;
  iterator_seek_wal_only_test();
LAB_0011a407:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a412;
  iterator_seek_wal_only_test();
LAB_0011a412:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a41d;
  iterator_seek_wal_only_test();
LAB_0011a41d:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a428;
  iterator_seek_wal_only_test();
LAB_0011a428:
  ppfStack_4e0 = (fdb_kvs_handle **)iterator_after_wal_threshold;
  iterator_seek_wal_only_test();
  pcStack_868 = (code *)0x11a44a;
  pfStack_508 = pfVar9;
  aStack_500 = unaff_R12;
  sStack_4f8 = unaff_R13;
  pfStack_4f0 = pfVar4;
  pfStack_4e8 = pfVar16;
  ppfStack_4e0 = unaff_RBP;
  gettimeofday(&tStack_830,(__timezone_ptr_t)0x0);
  pcStack_868 = (code *)0x11a44f;
  memleak_start();
  pfStack_858 = (fdb_iterator *)0x0;
  pcStack_868 = (code *)0x11a465;
  fdb_get_default_config();
  pcStack_868 = (code *)0x11a472;
  fdb_get_default_kvs_config();
  fStack_808.wal_threshold = 10;
  fStack_808.flags = 1;
  fStack_808.seqtree_opt = '\x01';
  pcStack_868 = (code *)0x11a493;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_868 = (code *)0x11a4aa;
  fdb_open(&pfStack_838,"./iterator_test1",&fStack_808);
  pcStack_868 = (code *)0x11a4c1;
  fdb_kvs_open(pfStack_838,&pfStack_848,"db1",&fStack_820);
  pcStack_868 = (code *)0x11a4d8;
  fdb_kvs_open(pfStack_838,&pfStack_840,"db2",&fStack_820);
  uVar11 = 0;
  do {
    pcStack_868 = (code *)0x11a504;
    sprintf(acStack_610,"key%d",uVar11);
    pcStack_868 = (code *)0x11a513;
    sprintf(acStack_710,"body%d",uVar11);
    pfVar16 = pfStack_848;
    pcStack_868 = (code *)0x11a520;
    ppfVar6 = (fdb_iterator **)strlen(acStack_610);
    pcStack_868 = (code *)0x11a52b;
    sVar5 = strlen(acStack_710);
    pcStack_868 = (code *)0x11a53f;
    fdb_set_kv(pfVar16,acStack_610,(size_t)ppfVar6,acStack_710,sVar5);
    uVar15 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar15;
  } while (uVar15 != 6);
  pcStack_868 = (code *)0x11a55c;
  fVar2 = fdb_iterator_sequence_init(pfStack_848,&pfStack_850,0,0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    do {
      pcStack_868 = (code *)0x11a576;
      fVar2 = fdb_iterator_get(pfStack_850,(fdb_doc **)&pfStack_858);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011a6b9:
        pcStack_868 = (code *)0x11a6be;
        iterator_after_wal_threshold();
        goto LAB_0011a6be;
      }
      pcStack_868 = (code *)0x11a599;
      fVar2 = fdb_set_kv(pfStack_840,(void *)pfStack_858->_seqnum,(size_t)pfStack_858->handle,
                         (void *)0x0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_868 = (code *)0x11a6b9;
        iterator_after_wal_threshold();
        goto LAB_0011a6b9;
      }
      pcStack_868 = (code *)0x11a5ab;
      fdb_doc_free((fdb_doc *)pfStack_858);
      pfStack_858 = (fdb_iterator *)0x0;
      pcStack_868 = (code *)0x11a5be;
      fVar2 = fdb_iterator_next(pfStack_850);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ppfVar6 = &pfStack_850;
    pcStack_868 = (code *)0x11a5d0;
    fdb_iterator_close(pfStack_850);
    pcStack_868 = (code *)0x11a5e4;
    fVar2 = fdb_iterator_sequence_init(pfStack_848,ppfVar6,0,0,0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      while( true ) {
        pcStack_868 = (code *)0x11a5fe;
        fVar2 = fdb_iterator_get(pfStack_850,(fdb_doc **)&pfStack_858);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pcStack_868 = (code *)0x11a615;
        fVar2 = fdb_get(pfStack_848,(fdb_doc *)pfStack_858);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a6be;
        pcStack_868 = (code *)0x11a627;
        fdb_doc_free((fdb_doc *)pfStack_858);
        pfStack_858 = (fdb_iterator *)0x0;
        pcStack_868 = (code *)0x11a63a;
        fVar2 = fdb_iterator_next(pfStack_850);
        if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
          pcStack_868 = (code *)0x11a649;
          fdb_iterator_close(pfStack_850);
          pcStack_868 = (code *)0x11a653;
          fdb_kvs_close(pfStack_848);
          pcStack_868 = (code *)0x11a65d;
          fdb_kvs_close(pfStack_840);
          pcStack_868 = (code *)0x11a667;
          fdb_close(pfStack_838);
          pcStack_868 = (code *)0x11a66c;
          fdb_shutdown();
          pcStack_868 = (code *)0x11a671;
          memleak_end();
          pcVar17 = "%s PASSED\n";
          if (iterator_after_wal_threshold()::__test_pass != '\0') {
            pcVar17 = "%s FAILED\n";
          }
          pcStack_868 = (code *)0x11a6a2;
          fprintf(_stderr,pcVar17,"iterator after wal threshold");
          return;
        }
      }
LAB_0011a6c3:
      ppfVar6 = &pfStack_858;
      pcStack_868 = (code *)0x11a6c8;
      iterator_after_wal_threshold();
      goto LAB_0011a6c8;
    }
  }
  else {
LAB_0011a6c8:
    pcStack_868 = (code *)0x11a6cd;
    iterator_after_wal_threshold();
  }
  pcStack_868 = iterator_manual_wal_flush;
  iterator_after_wal_threshold();
  pcStack_870 = "body%d";
  pfStack_880 = pfVar16;
  pfStack_a30 = (fdb_kvs_handle *)0x11a6ef;
  ppfStack_890 = ppfVar6;
  pcStack_888 = acStack_710;
  pcStack_878 = acStack_610;
  pcStack_868 = (code *)uVar11;
  gettimeofday(&tStack_9b0,(__timezone_ptr_t)0x0);
  pfStack_a30 = (fdb_kvs_handle *)0x11a6f4;
  memleak_start();
  uStack_9d0 = 0x3106002d;
  uStack_9d8 = 0x3032343e3e0508;
  uStack_9d1 = 0x31;
  uStack_9c8._0_2_ = 0x508;
  uStack_9c8._2_6_ = 0x313032343e3e;
  pvStack_9c0 = (void *)0x323106002d31;
  uStack_9b8 = 0;
  ptr_iterator = (fdb_kvs_handle **)auStack_9e8;
  auStack_9e8._0_7_ = 0x3931343e3e0508;
  auStack_9e8._7_4_ = 0x2d3939;
  uStack_a08 = 0x3433343e3e0508;
  uStack_a01 = 0x140a35;
  pfStack_a18 = (fdb_kvs_handle *)0x0;
  pfStack_a30 = (fdb_kvs_handle *)0x11a772;
  fdb_get_default_config();
  pfVar16 = (fdb_kvs_handle *)auStack_9a0;
  pfStack_a30 = (fdb_kvs_handle *)0x11a782;
  fdb_get_default_kvs_config();
  pfStack_978 = (fdb_file_handle *)0x400;
  uStack_964 = 1;
  pfStack_a30 = (fdb_kvs_handle *)0x11a79e;
  system("rm -rf  iterator_test* > errorlog.txt");
  ptr_fhandle_00 = (btree *)&pfStack_9f0;
  pfStack_a30 = (fdb_kvs_handle *)0x11a7b5;
  fdb_open((fdb_file_handle **)ptr_fhandle_00,"./iterator_test1",(fdb_config *)(auStack_9a0 + 0x18))
  ;
  ppfVar13 = &pfStack_9f8;
  pfStack_a30 = (fdb_kvs_handle *)0x11a7d0;
  fdb_kvs_open(pfStack_9f0,ppfVar13,"db1",(fdb_kvs_config *)pfVar16);
  pfStack_a30 = (fdb_kvs_handle *)0x11a7e8;
  fdb_kvs_open(pfStack_9f0,&pfStack_a10,"db2",(fdb_kvs_config *)pfVar16);
  pfStack_a30 = (fdb_kvs_handle *)0x11a7fe;
  fdb_set_kv(pfStack_9f8,&uStack_9d8,0xf,(void *)0x0,0);
  pfStack_a30 = (fdb_kvs_handle *)0x11a814;
  fdb_set_kv(pfStack_9f8,&uStack_9c8,0x11,(void *)0x0,0);
  pfStack_a30 = (fdb_kvs_handle *)0x11a81f;
  fdb_commit(pfStack_9f0,'\0');
  pfStack_a30 = (fdb_kvs_handle *)0x11a842;
  pfVar9 = pfStack_9f8;
  fVar2 = fdb_iterator_init(pfStack_9f8,(fdb_iterator **)&pfStack_a20,ptr_iterator,0xb,(void *)0x0,0
                            ,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    do {
      pfStack_a30 = (fdb_kvs_handle *)0x11a85c;
      pfVar9 = pfStack_a20;
      fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_a20,(fdb_doc **)&pfStack_a18);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_a30 = (fdb_kvs_handle *)0x11ab69;
        iterator_manual_wal_flush();
        goto LAB_0011ab69;
      }
      pfStack_a30 = (fdb_kvs_handle *)0x11a86e;
      fdb_doc_free((fdb_doc *)pfStack_a18);
      pfStack_a18 = (fdb_kvs_handle *)0x0;
      pfStack_a30 = (fdb_kvs_handle *)0x11a881;
      fVar2 = fdb_iterator_next((fdb_iterator *)pfStack_a20);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator = &pfStack_a20;
    pfStack_a30 = (fdb_kvs_handle *)0x11a893;
    fdb_iterator_close((fdb_iterator *)pfStack_a20);
    pfStack_a30 = (fdb_kvs_handle *)0x11a8b7;
    pfVar9 = pfStack_9f8;
    fVar2 = fdb_iterator_init(pfStack_9f8,(fdb_iterator **)ptr_iterator,&uStack_a08,0xb,(void *)0x0,
                              0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ab78;
    pfStack_a30 = (fdb_kvs_handle *)0x11a8ce;
    pfVar9 = pfStack_a20;
    fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_a20,(fdb_doc **)&pfStack_a18);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011ab7d;
    ptr_iterator = &pfStack_a20;
    pfStack_a30 = (fdb_kvs_handle *)0x11a8e3;
    fdb_iterator_close((fdb_iterator *)pfStack_a20);
    pfStack_a30 = (fdb_kvs_handle *)0x11a8fc;
    fdb_set_kv(pfStack_a10,&uStack_9d8,0xf,(void *)0x0,0);
    pfStack_a30 = (fdb_kvs_handle *)0x11a915;
    fdb_set_kv(pfStack_a10,&uStack_9c8,0x11,(void *)0x0,0);
    pfStack_a30 = (fdb_kvs_handle *)0x11a924;
    fdb_commit(pfStack_9f0,'\x01');
    pfStack_a30 = (fdb_kvs_handle *)0x11a948;
    pfVar9 = pfStack_a10;
    fVar2 = fdb_iterator_init(pfStack_a10,(fdb_iterator **)ptr_iterator,auStack_9e8,0xb,(void *)0x0,
                              0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ab82;
    do {
      pfStack_a30 = (fdb_kvs_handle *)0x11a962;
      pfVar9 = pfStack_a20;
      fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_a20,(fdb_doc **)&pfStack_a18);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ab69;
      pfStack_a30 = (fdb_kvs_handle *)0x11a974;
      fdb_doc_free((fdb_doc *)pfStack_a18);
      pfStack_a18 = (fdb_kvs_handle *)0x0;
      pfStack_a30 = (fdb_kvs_handle *)0x11a987;
      fVar2 = fdb_iterator_next((fdb_iterator *)pfStack_a20);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator = &pfStack_a20;
    pfStack_a30 = (fdb_kvs_handle *)0x11a999;
    fdb_iterator_close((fdb_iterator *)pfStack_a20);
    pfStack_a30 = (fdb_kvs_handle *)0x11a9bd;
    pfVar9 = pfStack_9f8;
    fVar2 = fdb_iterator_init(pfStack_9f8,(fdb_iterator **)ptr_iterator,&uStack_a08,0xb,(void *)0x0,
                              0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ab87;
    pfStack_a30 = (fdb_kvs_handle *)0x11a9d4;
    pfVar9 = pfStack_a20;
    fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_a20,(fdb_doc **)&pfStack_a18);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011ab8c;
    ptr_iterator = &pfStack_a20;
    pfStack_a30 = (fdb_kvs_handle *)0x11a9e9;
    fdb_iterator_close((fdb_iterator *)pfStack_a20);
    pfStack_a30 = (fdb_kvs_handle *)0x11aa0c;
    fVar2 = fdb_iterator_init(pfStack_a10,(fdb_iterator **)ptr_iterator,(void *)0x0,0,auStack_9e8,
                              0xb,0);
    pfVar9 = pfStack_a10;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ab91;
    pfStack_a30 = (fdb_kvs_handle *)0x11aa2d;
    pfVar9 = pfStack_a20;
    fVar2 = fdb_iterator_seek((fdb_iterator *)pfStack_a20,auStack_9e8,0xb,'\x01');
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011ab96;
    ptr_iterator = &pfStack_a20;
    pfStack_a30 = (fdb_kvs_handle *)0x11aa42;
    fdb_iterator_close((fdb_iterator *)pfStack_a20);
    pfStack_a30 = (fdb_kvs_handle *)0x11aa65;
    fVar2 = fdb_iterator_init(pfStack_9f8,(fdb_iterator **)ptr_iterator,(void *)0x0,0,&uStack_a08,
                              0xb,0);
    pfVar9 = pfStack_9f8;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ab9b;
    pfStack_a30 = (fdb_kvs_handle *)0x11aa86;
    pfVar9 = pfStack_a20;
    fVar2 = fdb_iterator_seek((fdb_iterator *)pfStack_a20,&uStack_a08,0xb,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aba0;
    pfStack_a30 = (fdb_kvs_handle *)0x11aa9d;
    pfVar9 = pfStack_a20;
    fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_a20,(fdb_doc **)&pfStack_a18);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_a30 = (fdb_kvs_handle *)0x11aaaf;
      fdb_doc_free((fdb_doc *)pfStack_a18);
      pfStack_a18 = (fdb_kvs_handle *)0x0;
      pfStack_a30 = (fdb_kvs_handle *)0x11aac2;
      fVar2 = fdb_iterator_prev((fdb_iterator *)pfStack_a20);
      if (fVar2 != FDB_RESULT_ITERATOR_FAIL) {
        do {
          pfStack_a30 = (fdb_kvs_handle *)0x11aad9;
          pfVar9 = pfStack_a20;
          fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_a20,(fdb_doc **)&pfStack_a18);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ab6e;
          pfStack_a30 = (fdb_kvs_handle *)0x11aaeb;
          fdb_doc_free((fdb_doc *)pfStack_a18);
          pfStack_a18 = (fdb_kvs_handle *)0x0;
          pfStack_a30 = (fdb_kvs_handle *)0x11aafe;
          fVar2 = fdb_iterator_prev((fdb_iterator *)pfStack_a20);
        } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      }
      pfStack_a30 = (fdb_kvs_handle *)0x11ab0d;
      fdb_iterator_close((fdb_iterator *)pfStack_a20);
      pfStack_a30 = (fdb_kvs_handle *)0x11ab17;
      fdb_close(pfStack_9f0);
      pfStack_a30 = (fdb_kvs_handle *)0x11ab1c;
      fdb_shutdown();
      pfStack_a30 = (fdb_kvs_handle *)0x11ab21;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (iterator_manual_wal_flush()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_a30 = (fdb_kvs_handle *)0x11ab52;
      fprintf(_stderr,pcVar17,"iterator manual wal flush");
      return;
    }
  }
  else {
LAB_0011ab73:
    pfStack_a30 = (fdb_kvs_handle *)0x11ab78;
    iterator_manual_wal_flush();
LAB_0011ab78:
    pfStack_a30 = (fdb_kvs_handle *)0x11ab7d;
    iterator_manual_wal_flush();
LAB_0011ab7d:
    pfStack_a30 = (fdb_kvs_handle *)0x11ab82;
    iterator_manual_wal_flush();
LAB_0011ab82:
    pfStack_a30 = (fdb_kvs_handle *)0x11ab87;
    iterator_manual_wal_flush();
LAB_0011ab87:
    pfStack_a30 = (fdb_kvs_handle *)0x11ab8c;
    iterator_manual_wal_flush();
LAB_0011ab8c:
    pfStack_a30 = (fdb_kvs_handle *)0x11ab91;
    iterator_manual_wal_flush();
LAB_0011ab91:
    pfStack_a30 = (fdb_kvs_handle *)0x11ab96;
    iterator_manual_wal_flush();
LAB_0011ab96:
    pfStack_a30 = (fdb_kvs_handle *)0x11ab9b;
    iterator_manual_wal_flush();
LAB_0011ab9b:
    pfStack_a30 = (fdb_kvs_handle *)0x11aba0;
    iterator_manual_wal_flush();
LAB_0011aba0:
    pfStack_a30 = (fdb_kvs_handle *)0x11aba5;
    iterator_manual_wal_flush();
  }
  pfStack_a30 = (fdb_kvs_handle *)sequence_iterator_seek_test;
  iterator_manual_wal_flush();
  ptr_iterator_00 = (fdb_config **)((ulong)pfVar9 & 0xffffffff);
  pfStack_ef8 = (fdb_kvs_handle *)0x11abcf;
  ppfStack_a58 = ptr_iterator;
  pbStack_a50 = ptr_fhandle_00;
  ppfStack_a48 = ppfVar13;
  puStack_a40 = &uStack_9c8;
  puStack_a38 = &uStack_9d8;
  pfStack_a30 = pfVar16;
  gettimeofday(&tStack_e60,(__timezone_ptr_t)0x0);
  pfStack_ef8 = (fdb_kvs_handle *)0x11abd4;
  memleak_start();
  pfStack_ee0 = (fdb_config *)0x0;
  pfStack_ef8 = (fdb_kvs_handle *)0x11abe5;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar14 = &fStack_b50;
  pfStack_ef8 = (fdb_kvs_handle *)0x11abf5;
  fdb_get_default_config();
  pfStack_ef8 = (fdb_kvs_handle *)0x11abff;
  fdb_get_default_kvs_config();
  fStack_b50.buffercache_size = 0;
  fStack_b50.wal_threshold = 0x400;
  fStack_b50.seqtree_opt = '\x01';
  fStack_b50.flags = 1;
  fStack_b50.multi_kv_instances = SUB81(ptr_iterator_00,0);
  fStack_b50.compaction_threshold = '\0';
  ptr_fhandle = &pfStack_ed0;
  pfStack_ef8 = (fdb_kvs_handle *)0x11ac38;
  fdb_open(ptr_fhandle,"./iterator_test7",pfVar14);
  if ((int)pfVar9 == 0) {
    pfStack_ef8 = (fdb_kvs_handle *)0x11ac66;
    fdb_kvs_open_default(pfStack_ed0,&pfStack_ed8,&fStack_ec8);
  }
  else {
    pfStack_ef8 = (fdb_kvs_handle *)0x11ac55;
    fdb_kvs_open(pfStack_ed0,&pfStack_ed8,"kv1",&fStack_ec8);
  }
  pfStack_ef8 = (fdb_kvs_handle *)0x11ac7e;
  fVar2 = fdb_set_log_callback(pfStack_ed8,logCallbackFunc,"sequence_iterator_seek_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      pfVar1 = &fStack_e50.config.encryption_key;
      pfStack_ef8 = (fdb_kvs_handle *)0x11aca6;
      sprintf((char *)pfVar1,"key%d",uVar11 & 0xffffffff);
      pfStack_ef8 = (fdb_kvs_handle *)0x11acbe;
      sprintf((char *)&fStack_e50.bub_ctx.handle,"meta%d",uVar11 & 0xffffffff);
      pfStack_ef8 = (fdb_kvs_handle *)0x11acd6;
      sprintf((char *)&fStack_e50,"body%d",uVar11 & 0xffffffff);
      pfStack_ef8 = (fdb_kvs_handle *)0x11ace6;
      sVar5 = strlen((char *)pfVar1);
      ppfVar13 = &fStack_e50.bub_ctx.handle;
      pfStack_ef8 = (fdb_kvs_handle *)0x11acf9;
      sVar7 = strlen((char *)ppfVar13);
      pfStack_ef8 = (fdb_kvs_handle *)0x11ad09;
      sVar8 = strlen((char *)&fStack_e50);
      pfStack_ef8 = (fdb_kvs_handle *)0x11ad2e;
      fdb_doc_create((fdb_doc **)((long)apfStack_eb0 + lVar12),&fStack_e50.config.encryption_key,
                     sVar5,ppfVar13,sVar7,&fStack_e50,sVar8);
      pfStack_ef8 = (fdb_kvs_handle *)0x11ad3d;
      fdb_set(pfStack_ed8,apfStack_eb0[uVar11]);
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 8;
    } while (uVar11 != 5);
    pfStack_ef8 = (fdb_kvs_handle *)0x11ad5d;
    fdb_commit(pfStack_ed0,'\x01');
    uVar11 = 5;
    pfVar14 = (fdb_config *)apfStack_e88;
    do {
      pfVar1 = &fStack_e50.config.encryption_key;
      pfStack_ef8 = (fdb_kvs_handle *)0x11ad82;
      sprintf((char *)pfVar1,"key%d",uVar11 & 0xffffffff);
      ppfVar13 = &fStack_e50.bub_ctx.handle;
      pfStack_ef8 = (fdb_kvs_handle *)0x11ad9d;
      sprintf((char *)ppfVar13,"meta%d",uVar11 & 0xffffffff);
      pfVar16 = &fStack_e50;
      pfStack_ef8 = (fdb_kvs_handle *)0x11adb8;
      sprintf((char *)pfVar16,"body%d",uVar11 & 0xffffffff);
      pfStack_ef8 = (fdb_kvs_handle *)0x11adc0;
      ptr_fhandle = (fdb_file_handle **)strlen((char *)pfVar1);
      pfStack_ef8 = (fdb_kvs_handle *)0x11adcb;
      ptr_fhandle_00 = (btree *)strlen((char *)ppfVar13);
      pfStack_ef8 = (fdb_kvs_handle *)0x11add6;
      sVar5 = strlen((char *)pfVar16);
      pfStack_ef8 = (fdb_kvs_handle *)0x11adf6;
      fdb_doc_create((fdb_doc **)pfVar14,&fStack_e50.config.encryption_key,(size_t)ptr_fhandle,
                     ppfVar13,(size_t)ptr_fhandle_00,pfVar16,sVar5);
      pfStack_ef8 = (fdb_kvs_handle *)0x11ae03;
      fdb_set(pfStack_ed8,(fdb_doc *)*(fdb_kvs_handle **)pfVar14);
      uVar11 = uVar11 + 1;
      pfVar14 = (fdb_config *)((long)pfVar14 + 8);
    } while (uVar11 != 10);
    pfStack_ef8 = (fdb_kvs_handle *)0x11ae20;
    fdb_commit(pfStack_ed0,'\0');
    ptr_iterator_00 = &pfStack_ee8;
    pfStack_ef8 = (fdb_kvs_handle *)0x11ae39;
    fdb_iterator_sequence_init(pfStack_ed8,(fdb_iterator **)ptr_iterator_00,0,0,0);
    pfStack_ef8 = (fdb_kvs_handle *)0x11ae41;
    fVar2 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_ee8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b1b2;
    ppfVar13 = apfStack_e88 + 4;
    pfVar21 = pfVar14;
    do {
      pfStack_ef8 = (fdb_kvs_handle *)0x11ae63;
      fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_ee8,(fdb_doc **)&pfStack_ee0);
      pfVar14 = pfStack_ee0;
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011b146:
        pfStack_ef8 = (fdb_kvs_handle *)0x11b14b;
        sequence_iterator_seek_test();
        pfVar14 = pfVar21;
LAB_0011b14b:
        pfStack_ef8 = (fdb_kvs_handle *)0x11b156;
        sequence_iterator_seek_test();
LAB_0011b156:
        pfStack_ef8 = (fdb_kvs_handle *)0x11b161;
        sequence_iterator_seek_test();
        goto LAB_0011b161;
      }
      sVar5._0_2_ = pfStack_ee0->chunksize;
      sVar5._2_2_ = *(undefined2 *)&pfStack_ee0->field_0x2;
      sVar5._4_4_ = pfStack_ee0->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_ee0->seqtree_opt;
      pfVar16 = *ppfVar13;
      ptr_fhandle_00 = (btree *)pfVar16->op_stats;
      pfStack_ef8 = (fdb_kvs_handle *)0x11ae8a;
      iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,sVar5);
      pfVar21 = pfVar14;
      if (iVar3 != 0) {
        pfStack_ef8 = (fdb_kvs_handle *)0x11b146;
        sequence_iterator_seek_test();
        goto LAB_0011b146;
      }
      ptr_fhandle = (fdb_file_handle **)pfVar14->compactor_sleep_duration;
      ptr_fhandle_00 = pfVar16->staletree;
      pfStack_ef8 = (fdb_kvs_handle *)0x11aea9;
      iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar14->buffercache_size);
      if (iVar3 != 0) goto LAB_0011b156;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar14->multi_kv_instances;
      ptr_fhandle_00 = (pfVar16->field_6).seqtree;
      pfStack_ef8 = (fdb_kvs_handle *)0x11aec8;
      iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar14->wal_threshold);
      if (iVar3 != 0) goto LAB_0011b14b;
      pfStack_ef8 = (fdb_kvs_handle *)0x11aed8;
      fdb_doc_free((fdb_doc *)pfVar14);
      pfStack_ee0 = (fdb_config *)0x0;
      pfStack_ef8 = (fdb_kvs_handle *)0x11aeeb;
      fVar2 = fdb_iterator_prev((fdb_iterator *)pfStack_ee8);
      ppfVar13 = ppfVar13 + -1;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_ee8;
    pfStack_ef8 = (fdb_kvs_handle *)0x11af05;
    fdb_iterator_close((fdb_iterator *)pfStack_ee8);
    pfStack_ef8 = (fdb_kvs_handle *)0x11af1c;
    fdb_iterator_sequence_init(pfStack_ed8,(fdb_iterator **)ptr_iterator_00,0,7,0);
    pfStack_ef8 = (fdb_kvs_handle *)0x11af24;
    fVar2 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_ee8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b1b7;
    ppfVar13 = apfStack_e88 + 1;
    do {
      pfStack_ef8 = (fdb_kvs_handle *)0x11af43;
      fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_ee8,(fdb_doc **)&pfStack_ee0);
      pfVar14 = pfStack_ee0;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b16c;
      sVar7._0_2_ = pfStack_ee0->chunksize;
      sVar7._2_2_ = *(undefined2 *)&pfStack_ee0->field_0x2;
      sVar7._4_4_ = pfStack_ee0->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_ee0->seqtree_opt;
      pfVar16 = *ppfVar13;
      ptr_fhandle_00 = (btree *)pfVar16->op_stats;
      pfStack_ef8 = (fdb_kvs_handle *)0x11af6a;
      iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,sVar7);
      if (iVar3 != 0) goto LAB_0011b161;
      ptr_fhandle = (fdb_file_handle **)pfVar14->compactor_sleep_duration;
      ptr_fhandle_00 = pfVar16->staletree;
      pfStack_ef8 = (fdb_kvs_handle *)0x11af89;
      iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar14->buffercache_size);
      if (iVar3 != 0) goto LAB_0011b17c;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar14->multi_kv_instances;
      ptr_fhandle_00 = (pfVar16->field_6).seqtree;
      pfStack_ef8 = (fdb_kvs_handle *)0x11afa8;
      iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar14->wal_threshold);
      if (iVar3 != 0) goto LAB_0011b171;
      pfStack_ef8 = (fdb_kvs_handle *)0x11afb8;
      fdb_doc_free((fdb_doc *)pfVar14);
      pfStack_ee0 = (fdb_config *)0x0;
      pfStack_ef8 = (fdb_kvs_handle *)0x11afcb;
      fVar2 = fdb_iterator_prev((fdb_iterator *)pfStack_ee8);
      ppfVar13 = ppfVar13 + -1;
      pfVar21 = pfVar14;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_ee8;
    pfStack_ef8 = (fdb_kvs_handle *)0x11afe5;
    fdb_iterator_close((fdb_iterator *)pfStack_ee8);
    pfStack_ef8 = (fdb_kvs_handle *)0x11afff;
    fdb_iterator_sequence_init(pfStack_ed8,(fdb_iterator **)ptr_iterator_00,0,7,8);
    pfStack_ef8 = (fdb_kvs_handle *)0x11b007;
    fVar2 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_ee8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      ppfVar13 = apfStack_e88;
      while( true ) {
        pfStack_ef8 = (fdb_kvs_handle *)0x11b026;
        fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_ee8,(fdb_doc **)&pfStack_ee0);
        pfVar14 = pfStack_ee0;
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        sVar8._0_2_ = pfStack_ee0->chunksize;
        sVar8._2_2_ = *(undefined2 *)&pfStack_ee0->field_0x2;
        sVar8._4_4_ = pfStack_ee0->blocksize;
        ptr_fhandle = *(fdb_file_handle ***)&pfStack_ee0->seqtree_opt;
        pfVar16 = *ppfVar13;
        ptr_fhandle_00 = (btree *)pfVar16->op_stats;
        pfStack_ef8 = (fdb_kvs_handle *)0x11b04d;
        iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,sVar8);
        if (iVar3 != 0) goto LAB_0011b187;
        ptr_fhandle = (fdb_file_handle **)pfVar14->compactor_sleep_duration;
        ptr_fhandle_00 = pfVar16->staletree;
        pfStack_ef8 = (fdb_kvs_handle *)0x11b06c;
        iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar14->buffercache_size);
        if (iVar3 != 0) goto LAB_0011b1a2;
        ptr_fhandle = *(fdb_file_handle ***)&pfVar14->multi_kv_instances;
        ptr_fhandle_00 = (pfVar16->field_6).seqtree;
        pfStack_ef8 = (fdb_kvs_handle *)0x11b08b;
        iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar14->wal_threshold);
        if (iVar3 != 0) goto LAB_0011b197;
        pfStack_ef8 = (fdb_kvs_handle *)0x11b09b;
        fdb_doc_free((fdb_doc *)pfVar14);
        pfStack_ee0 = (fdb_config *)0x0;
        pfStack_ef8 = (fdb_kvs_handle *)0x11b0ae;
        fVar2 = fdb_iterator_prev((fdb_iterator *)pfStack_ee8);
        ppfVar13 = ppfVar13 + -1;
        pfVar21 = pfVar14;
        if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
          pfStack_ef8 = (fdb_kvs_handle *)0x11b0c5;
          fdb_iterator_close((fdb_iterator *)pfStack_ee8);
          pfStack_ef8 = (fdb_kvs_handle *)0x11b0cf;
          fdb_kvs_close(pfStack_ed8);
          pfStack_ef8 = (fdb_kvs_handle *)0x11b0d9;
          fdb_close(pfStack_ed0);
          lVar12 = 0;
          do {
            pfStack_ef8 = (fdb_kvs_handle *)0x11b0e5;
            fdb_doc_free(apfStack_eb0[lVar12]);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 10);
          pfStack_ef8 = (fdb_kvs_handle *)0x11b0f3;
          fdb_shutdown();
          pfStack_ef8 = (fdb_kvs_handle *)0x11b0f8;
          memleak_end();
          pcVar17 = "%s PASSED\n";
          if (sequence_iterator_seek_test(bool)::__test_pass != '\0') {
            pcVar17 = "%s FAILED\n";
          }
          pfStack_ef8 = (fdb_kvs_handle *)0x11b129;
          fprintf(_stderr,pcVar17,"sequence iterator seek test");
          return;
        }
      }
LAB_0011b192:
      pfVar14 = pfVar21;
      pfStack_ef8 = (fdb_kvs_handle *)0x11b197;
      sequence_iterator_seek_test();
LAB_0011b197:
      pfStack_ef8 = (fdb_kvs_handle *)0x11b1a2;
      sequence_iterator_seek_test();
LAB_0011b1a2:
      ptr_iterator_00 = &pfStack_ee0;
      pfStack_ef8 = (fdb_kvs_handle *)0x11b1ad;
      sequence_iterator_seek_test();
      goto LAB_0011b1ad;
    }
  }
  else {
LAB_0011b1ad:
    pfStack_ef8 = (fdb_kvs_handle *)0x11b1b2;
    sequence_iterator_seek_test();
LAB_0011b1b2:
    pfStack_ef8 = (fdb_kvs_handle *)0x11b1b7;
    sequence_iterator_seek_test();
LAB_0011b1b7:
    pfStack_ef8 = (fdb_kvs_handle *)0x11b1bc;
    sequence_iterator_seek_test();
  }
  pfStack_ef8 = (fdb_kvs_handle *)iterator_concurrent_compaction;
  sequence_iterator_seek_test();
  ppfStack_12a0 = (fdb_doc **)0x11b1de;
  ppfStack_f20 = ptr_iterator_00;
  pbStack_f18 = ptr_fhandle_00;
  ppfStack_f10 = ppfVar13;
  pfStack_f08 = pfVar14;
  ppfStack_f00 = ptr_fhandle;
  pfStack_ef8 = pfVar16;
  gettimeofday((timeval *)(auStack_1258 + 0x28),(__timezone_ptr_t)0x0);
  ppfStack_12a0 = (fdb_doc **)0x11b1e3;
  memleak_start();
  pfStack_1290 = (fdb_kvs_handle *)0x0;
  ppfStack_12a0 = (fdb_doc **)0x11b1f9;
  fdb_get_default_config();
  ppfStack_12a0 = (fdb_doc **)0x11b206;
  fdb_get_default_kvs_config();
  fStack_1220.wal_threshold = 0x400;
  fStack_1220.seqtree_opt = '\x01';
  fStack_1220.flags = 1;
  ppfStack_12a0 = (fdb_doc **)0x11b225;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_12a0 = (fdb_doc **)0x11b23c;
  fdb_open(&pfStack_1270,"./iterator_test1",&fStack_1220);
  ppfStack_12a0 = (fdb_doc **)0x11b253;
  fdb_kvs_open(pfStack_1270,&pfStack_1278,"db",(fdb_kvs_config *)(auStack_1258 + 0x10));
  pcVar17 = "body%d";
  pfVar16 = (fdb_kvs_handle *)(apfStack_1128 + 0x20);
  doc = (fdb_doc **)0x0;
  do {
    ppfStack_12a0 = (fdb_doc **)0x11b27f;
    sprintf((char *)apfStack_1128,"key%d",doc);
    ppfStack_12a0 = (fdb_doc **)0x11b28e;
    sprintf((char *)pfVar16,"body%d",doc);
    pfVar9 = pfStack_1278;
    ppfStack_12a0 = (fdb_doc **)0x11b29b;
    sVar5 = strlen((char *)apfStack_1128);
    ppfStack_12a0 = (fdb_doc **)0x11b2a6;
    sVar7 = strlen((char *)pfVar16);
    ppfStack_12a0 = (fdb_doc **)0x11b2ba;
    fdb_set_kv(pfVar9,apfStack_1128,sVar5,pfVar16,sVar7);
    uVar15 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar15;
  } while (uVar15 != 10);
  ppfStack_12a0 = (fdb_doc **)0x11b2cd;
  fdb_commit(pfStack_1270,'\0');
  ppfStack_12a0 = (fdb_doc **)0x11b2e6;
  fdb_open(&pfStack_1260,"./iterator_test1",&fStack_1220);
  ppfVar13 = (fdb_kvs_handle **)(auStack_1258 + 8);
  ppfStack_12a0 = (fdb_doc **)0x11b302;
  fdb_kvs_open(pfStack_1260,ppfVar13,"db",(fdb_kvs_config *)(auStack_1258 + 0x10));
  ppfStack_12a0 = (fdb_doc **)0x11b313;
  fdb_compact(pfStack_1270,"./iterator_test2");
  ppfStack_12a0 = (fdb_doc **)0x11b331;
  fVar2 = fdb_iterator_init((fdb_kvs_handle *)auStack_1258._8_8_,&pfStack_1280,(void *)0x0,0,
                            (void *)0x0,0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    ppfStack_12a0 = (fdb_doc **)0x11b34f;
    fVar2 = fdb_iterator_sequence_init(pfStack_1278,&pfStack_1288,0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b4bb;
    pcVar17 = (char *)&pfStack_1268;
    pfVar16 = (fdb_kvs_handle *)auStack_1258;
    doc = (fdb_doc **)0x0;
    do {
      ppfStack_12a0 = (fdb_doc **)0x11b381;
      sprintf((char *)apfStack_1128,"key%d",doc);
      pfVar9 = pfStack_1278;
      ppfStack_12a0 = (fdb_doc **)0x11b38e;
      sVar5 = strlen((char *)apfStack_1128);
      ppfStack_12a0 = (fdb_doc **)0x11b3a2;
      fdb_get_kv(pfVar9,apfStack_1128,sVar5,(void **)pcVar17,(size_t *)pfVar16);
      ppfStack_12a0 = (fdb_doc **)0x11b3ac;
      fdb_free_block(pfStack_1268);
      uVar15 = (int)doc + 1;
      doc = (fdb_doc **)(ulong)uVar15;
    } while (uVar15 != 10);
    ppfVar13 = &pfStack_1290;
    do {
      pfStack_1290 = (fdb_kvs_handle *)0x0;
      ppfStack_12a0 = (fdb_doc **)0x11b3ce;
      fVar2 = fdb_iterator_get(pfStack_1280,(fdb_doc **)ppfVar13);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        ppfStack_12a0 = (fdb_doc **)0x11b4b1;
        iterator_concurrent_compaction();
        goto LAB_0011b4b1;
      }
      ppfStack_12a0 = (fdb_doc **)0x11b3e0;
      fdb_doc_free((fdb_doc *)pfStack_1290);
      ppfStack_12a0 = (fdb_doc **)0x11b3ea;
      fVar2 = fdb_iterator_next(pfStack_1280);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_12a0 = (fdb_doc **)0x11b3f9;
    fVar2 = fdb_iterator_close(pfStack_1280);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b4c0;
    ppfVar13 = &pfStack_1290;
    do {
      pfStack_1290 = (fdb_kvs_handle *)0x0;
      ppfStack_12a0 = (fdb_doc **)0x11b41c;
      fVar2 = fdb_iterator_get(pfStack_1288,(fdb_doc **)ppfVar13);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b4b1;
      ppfStack_12a0 = (fdb_doc **)0x11b42e;
      fdb_doc_free((fdb_doc *)pfStack_1290);
      ppfStack_12a0 = (fdb_doc **)0x11b438;
      fVar2 = fdb_iterator_next(pfStack_1288);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_12a0 = (fdb_doc **)0x11b447;
    fVar2 = fdb_iterator_close(pfStack_1288);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      ppfStack_12a0 = (fdb_doc **)0x11b455;
      fdb_close(pfStack_1270);
      ppfStack_12a0 = (fdb_doc **)0x11b45f;
      fdb_close(pfStack_1260);
      ppfStack_12a0 = (fdb_doc **)0x11b464;
      fdb_shutdown();
      ppfStack_12a0 = (fdb_doc **)0x11b469;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (iterator_concurrent_compaction()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      ppfStack_12a0 = (fdb_doc **)0x11b49a;
      fprintf(_stderr,pcVar17,"iterator with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011b4b6:
    ppfStack_12a0 = (fdb_doc **)0x11b4bb;
    iterator_concurrent_compaction();
LAB_0011b4bb:
    ppfStack_12a0 = (fdb_doc **)0x11b4c0;
    iterator_concurrent_compaction();
LAB_0011b4c0:
    ppfStack_12a0 = (fdb_doc **)0x11b4c5;
    iterator_concurrent_compaction();
  }
  doc_00 = (char *)apfStack_1128;
  ppfStack_12a0 = (fdb_doc **)iterator_offset_access_test;
  iterator_concurrent_compaction();
  ppfStack_3578 = (fdb_doc **)0x11b4e7;
  ppfStack_12c8 = ppfVar13;
  pfStack_12c0 = pfVar16;
  ppfStack_12b0 = (fdb_doc **)doc_00;
  ppfStack_12a8 = (fdb_doc **)pcVar17;
  ppfStack_12a0 = doc;
  gettimeofday(&tStack_3520,(__timezone_ptr_t)0x0);
  ppfStack_3578 = (fdb_doc **)0x11b4ec;
  memleak_start();
  pfStack_3548 = (fdb_doc *)0x0;
  ppfStack_3578 = (fdb_doc **)0x11b501;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar9 = (fdb_kvs_handle *)(auStack_3410 + 0x108);
  ppfStack_3578 = (fdb_doc **)0x11b511;
  fdb_get_default_config();
  ppfStack_3578 = (fdb_doc **)0x11b51b;
  fdb_get_default_kvs_config();
  auStack_3300[8] = '\0';
  auStack_3300[9] = '\x02';
  auStack_3300[10] = '\0';
  auStack_3300[0xb] = '\0';
  auStack_3300[0xc] = '\0';
  auStack_3300[0xd] = '\0';
  auStack_3300[0xe] = '\0';
  auStack_3300[0xf] = '\0';
  auStack_3300[0] = '\0';
  auStack_3300[1] = '\x10';
  auStack_3300[2] = '\0';
  auStack_3300[3] = '\0';
  auStack_3300[4] = '\0';
  auStack_3300[5] = '\0';
  auStack_3300[6] = '\0';
  auStack_3300[7] = '\0';
  uStack_32e4 = 1;
  uStack_32da = 0;
  uStack_32ec = 1;
  ppfStack_3578 = (fdb_doc **)0x11b54e;
  fVar2 = fdb_open(&pfStack_3558,"./iterator_test1",(fdb_config *)pfVar9);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    ppfStack_3578 = (fdb_doc **)0x11b571;
    fVar2 = fdb_kvs_open(pfStack_3558,&pfStack_3560,"DB",&fStack_3538);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba02;
    ppfStack_3578 = (fdb_doc **)0x11b594;
    fVar2 = fdb_kvs_open(pfStack_3558,&pfStack_3540,"ODB",&fStack_3538);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba07;
    doc_00 = (char *)apfStack_3510;
    pfVar16 = (fdb_kvs_handle *)auStack_3410;
    pcVar17 = (char *)0x0;
    uVar11 = 0;
    do {
      ppfStack_3578 = (fdb_doc **)0x11b5c3;
      sprintf(doc_00,"key%d",uVar11 & 0xffffffff);
      ppfStack_3578 = (fdb_doc **)0x11b5d7;
      sprintf((char *)pfVar16,"body%d",uVar11 & 0xffffffff);
      doc = (fdb_doc **)((long)apfStack_3210 + (long)pcVar17);
      ppfStack_3578 = (fdb_doc **)0x11b5ea;
      pfVar9 = (fdb_kvs_handle *)strlen(doc_00);
      ppfStack_3578 = (fdb_doc **)0x11b5f5;
      sVar5 = strlen((char *)pfVar16);
      ppfStack_3578 = (fdb_doc **)0x11b60f;
      fdb_doc_create(doc,doc_00,(size_t)pfVar9,(void *)0x0,0,pfVar16,sVar5);
      ppfStack_3578 = (fdb_doc **)0x11b621;
      fVar2 = fdb_set(pfStack_3560,apfStack_3210[uVar11]);
      pfVar4 = pfStack_3540;
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011b9d0:
        ppfStack_3578 = (fdb_doc **)0x11b9d5;
        iterator_offset_access_test();
        goto LAB_0011b9d5;
      }
      ppfStack_3578 = (fdb_doc **)0x11b636;
      sVar5 = strlen(doc_00);
      ppfStack_3578 = (fdb_doc **)0x11b656;
      fVar2 = fdb_set_kv(pfVar4,doc_00,sVar5,&apfStack_3210[uVar11]->offset,8);
      pfVar9 = pfVar4;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        ppfStack_3578 = (fdb_doc **)0x11b9d0;
        iterator_offset_access_test();
        goto LAB_0011b9d0;
      }
      uVar11 = uVar11 + 1;
      pcVar17 = (char *)((long)pcVar17 + 8);
    } while (uVar11 != 1000);
    ppfStack_3578 = (fdb_doc **)0x11b681;
    fVar2 = fdb_commit(pfStack_3558,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba0c;
    pfVar9 = (fdb_kvs_handle *)0xfa;
    doc_00 = "key%d";
    pcVar17 = (char *)apfStack_3510;
    do {
      ppfStack_3578 = (fdb_doc **)0x11b6a9;
      sprintf(pcVar17,"key%d",pfVar9);
      pfVar16 = pfStack_3560;
      ppfStack_3578 = (fdb_doc **)0x11b6b6;
      sVar5 = strlen(pcVar17);
      ppfStack_3578 = (fdb_doc **)0x11b6c4;
      fVar2 = fdb_del_kv(pfVar16,pcVar17,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9d5;
      uVar15 = (int)pfVar9 + 1;
      pfVar9 = (fdb_kvs_handle *)(ulong)uVar15;
    } while (uVar15 != 500);
    doc_00 = (char *)apfStack_3510;
    pfVar16 = (fdb_kvs_handle *)auStack_3410;
    pcVar17 = (char *)0x0;
    uVar11 = 0;
    do {
      ppfStack_3578 = (fdb_doc **)0x11b6fd;
      sprintf(doc_00,"k0y%d",uVar11 & 0xffffffff);
      ppfStack_3578 = (fdb_doc **)0x11b711;
      sprintf((char *)pfVar16,"b0dy%d",uVar11 & 0xffffffff);
      doc = (fdb_doc **)((long)apfStack_3210 + (long)pcVar17);
      ppfStack_3578 = (fdb_doc **)0x11b729;
      fdb_doc_free(apfStack_3210[uVar11]);
      ppfStack_3578 = (fdb_doc **)0x11b731;
      pfVar9 = (fdb_kvs_handle *)strlen(doc_00);
      ppfStack_3578 = (fdb_doc **)0x11b73c;
      sVar5 = strlen((char *)pfVar16);
      ppfStack_3578 = (fdb_doc **)0x11b756;
      fdb_doc_create(doc,doc_00,(size_t)pfVar9,(void *)0x0,0,pfVar16,sVar5);
      ppfStack_3578 = (fdb_doc **)0x11b768;
      fVar2 = fdb_set(pfStack_3560,apfStack_3210[uVar11]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9da;
      uVar11 = uVar11 + 1;
      pcVar17 = (char *)((long)pcVar17 + 8);
    } while (uVar11 != 0xfa);
    ppfStack_3578 = (fdb_doc **)0x11b790;
    fVar2 = fdb_commit(pfStack_3558,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba11;
    ppfStack_3578 = (fdb_doc **)0x11b7b8;
    fdb_iterator_init(pfStack_3540,&pfStack_3550,(void *)0x0,0,(void *)0x0,0,2);
    pcVar17 = (char *)0x1ea;
    pfVar9 = afStack_2270;
    doc_00 = (char *)&pfStack_3548;
    do {
      ppfStack_3578 = (fdb_doc **)0x11b7d8;
      fVar2 = fdb_get_byoffset(pfStack_3560,*(fdb_doc **)&pfVar9->kvs_config);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9e4;
      ppfStack_3578 = (fdb_doc **)0x11b7f6;
      fVar2 = fdb_iterator_seek(pfStack_3550,(void *)(*(size_t **)&pfVar9->kvs_config)[4],
                                **(size_t **)&pfVar9->kvs_config,'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9df;
      ppfStack_3578 = (fdb_doc **)0x11b80b;
      fVar2 = fdb_iterator_get(pfStack_3550,(fdb_doc **)doc_00);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9ee;
      if (*pfStack_3548->body != *(long *)(*(long *)&pfVar9->kvs_config + 0x30)) {
        ppfStack_3578 = (fdb_doc **)0x11b86c;
        iterator_offset_access_test();
      }
      ppfStack_3578 = (fdb_doc **)0x11b835;
      fVar2 = fdb_del(pfStack_3560,*(fdb_doc **)&pfVar9->kvs_config);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9e9;
      ppfStack_3578 = (fdb_doc **)0x11b84a;
      fdb_get_metaonly(pfStack_3560,*(fdb_doc **)&pfVar9->kvs_config);
      pcVar17 = (char *)((long)pcVar17 + 10);
      pfVar9 = (fdb_kvs_handle *)&pfVar9->dhandle;
    } while (pcVar17 < (fdb_doc **)0x3de);
    ppfStack_3578 = (fdb_doc **)0x11b878;
    fdb_iterator_close(pfStack_3550);
    ppfStack_3578 = (fdb_doc **)0x11b887;
    fVar2 = fdb_commit(pfStack_3558,'\x01');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      doc_00 = (char *)apfStack_3510;
      pcVar17 = "b1dy%d";
      pfVar16 = (fdb_kvs_handle *)auStack_3410;
      doc = (fdb_doc **)0x0;
      do {
        ppfStack_3578 = (fdb_doc **)0x11b8b8;
        sprintf(doc_00,"k1y%d",doc);
        ppfStack_3578 = (fdb_doc **)0x11b8c7;
        sprintf((char *)pfVar16,"b1dy%d",doc);
        pfVar4 = pfStack_3560;
        ppfStack_3578 = (fdb_doc **)0x11b8d4;
        pfVar9 = (fdb_kvs_handle *)strlen(doc_00);
        ppfStack_3578 = (fdb_doc **)0x11b8df;
        sVar5 = strlen((char *)pfVar16);
        ppfStack_3578 = (fdb_doc **)0x11b8f3;
        fVar2 = fdb_set_kv(pfVar4,doc_00,(size_t)pfVar9,pfVar16,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9f3;
        uVar15 = (int)doc + 1;
        doc = (fdb_doc **)(ulong)uVar15;
      } while (uVar15 != 0xfa);
      doc_00 = (char *)0x1ea;
      pfVar9 = afStack_2270;
      while( true ) {
        ppfStack_3578 = (fdb_doc **)0x11b920;
        fVar2 = fdb_get_byoffset(pfStack_3560,*(fdb_doc **)&pfVar9->kvs_config);
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) break;
        if (*(char *)(*(long *)&pfVar9->kvs_config + 0x48) == '\0') {
          ppfStack_3578 = (fdb_doc **)0x11b94d;
          iterator_offset_access_test();
        }
        doc_00 = (char *)((long)doc_00 + 10);
        pfVar9 = (fdb_kvs_handle *)&pfVar9->dhandle;
        if ((fdb_doc **)0x3dd < doc_00) {
          lVar12 = 0;
          do {
            ppfStack_3578 = (fdb_doc **)0x11b95e;
            fdb_doc_free(apfStack_3210[lVar12]);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 1000);
          ppfStack_3578 = (fdb_doc **)0x11b974;
          fdb_doc_free(pfStack_3548);
          ppfStack_3578 = (fdb_doc **)0x11b97e;
          fdb_close(pfStack_3558);
          ppfStack_3578 = (fdb_doc **)0x11b983;
          fdb_shutdown();
          ppfStack_3578 = (fdb_doc **)0x11b988;
          memleak_end();
          pcVar17 = "%s PASSED\n";
          if (iterator_offset_access_test()::__test_pass != '\0') {
            pcVar17 = "%s FAILED\n";
          }
          ppfStack_3578 = (fdb_doc **)0x11b9b9;
          fprintf(_stderr,pcVar17,"iterator offset access test");
          return;
        }
      }
LAB_0011b9f8:
      ppfStack_3578 = (fdb_doc **)0x11b9fd;
      iterator_offset_access_test();
      goto LAB_0011b9fd;
    }
  }
  else {
LAB_0011b9fd:
    ppfStack_3578 = (fdb_doc **)0x11ba02;
    iterator_offset_access_test();
LAB_0011ba02:
    ppfStack_3578 = (fdb_doc **)0x11ba07;
    iterator_offset_access_test();
LAB_0011ba07:
    ppfStack_3578 = (fdb_doc **)0x11ba0c;
    iterator_offset_access_test();
LAB_0011ba0c:
    ppfStack_3578 = (fdb_doc **)0x11ba11;
    iterator_offset_access_test();
LAB_0011ba11:
    ppfStack_3578 = (fdb_doc **)0x11ba16;
    iterator_offset_access_test();
  }
  ppfStack_3578 = (fdb_doc **)iterator_deleted_doc_right_before_the_end_test;
  iterator_offset_access_test();
  ppfStack_3a00 = (fdb_iterator **)0x11ba36;
  pfStack_3598 = pfVar9;
  pfStack_3590 = pfVar16;
  ppfStack_3588 = (fdb_doc **)doc_00;
  ppfStack_3580 = (fdb_doc **)pcVar17;
  ppfStack_3578 = doc;
  gettimeofday(&tStack_39c8,(__timezone_ptr_t)0x0);
  ppfStack_3a00 = (fdb_iterator **)0x11ba3b;
  memleak_start();
  ppfStack_3a00 = (fdb_iterator **)0x11ba4b;
  fdb_get_default_config();
  fStack_3790.buffercache_size = 0;
  ppfStack_3a00 = (fdb_iterator **)0x11ba63;
  fdb_get_default_kvs_config();
  ppfStack_3a00 = (fdb_iterator **)0x11ba86;
  sprintf(acStack_3898,"rm -rf  %s*","./dummy");
  ppfStack_3a00 = (fdb_iterator **)0x11ba8e;
  system(acStack_3898);
  ppfStack_3a00 = (fdb_iterator **)0x11baa1;
  fdb_open(&pfStack_39d0,"./dummy",&fStack_3790);
  ppfStack_3a00 = (fdb_iterator **)0x11bab4;
  fdb_kvs_open(pfStack_39d0,&pfStack_39d8,(char *)0x0,&fStack_38b0);
  uVar11 = 0;
  do {
    ppfStack_3a00 = (fdb_iterator **)0x11bae0;
    sprintf((char *)apfStack_39b8,"k%06d\n",uVar11);
    ppfStack_3a00 = (fdb_iterator **)0x11baef;
    sprintf(acStack_3698,"v%06d\n",uVar11);
    ppfStack_3a00 = (fdb_iterator **)0x11bb0a;
    fdb_set_kv(pfStack_39d8,apfStack_39b8,8,acStack_3698,8);
    uVar15 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar15;
  } while (uVar15 != 3);
  ppfStack_3a00 = (fdb_iterator **)0x11bb2c;
  sprintf((char *)apfStack_39b8,"k%06d\n",1);
  ppfStack_3a00 = (fdb_iterator **)0x11bb3e;
  fdb_del_kv(pfStack_39d8,apfStack_39b8,8);
  ppfStack_3a00 = (fdb_iterator **)0x11bb4a;
  fdb_commit(pfStack_39d0,'\0');
  apfStack_39b8[0]._0_2_ = 0x61;
  acStack_3898[0] = 'z';
  acStack_3898[1] = '\0';
  ppfStack_3a00 = (fdb_iterator **)0x11bb81;
  fVar2 = fdb_iterator_init(pfStack_39d8,&pfStack_39e8,apfStack_39b8,1,acStack_3898,1,2);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    ppfStack_3a00 = (fdb_iterator **)0x11bb93;
    fVar2 = fdb_iterator_seek_to_max(pfStack_39e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bdbc;
    pfStack_39e0 = (fdb_doc *)0x0;
    ppfStack_3a00 = (fdb_iterator **)0x11bbb1;
    fVar2 = fdb_iterator_get(pfStack_39e8,&pfStack_39e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bdc1;
    ppfStack_3a00 = (fdb_iterator **)0x11bbd4;
    sprintf((char *)apfStack_39b8,"k%06d\n",2);
    if (*pfStack_39e0->key != CONCAT62(apfStack_39b8[0]._2_6_,apfStack_39b8[0]._0_2_))
    goto LAB_0011bdc6;
    ppfStack_3a00 = (fdb_iterator **)0x11bbee;
    fdb_doc_free(pfStack_39e0);
    ppfStack_3a00 = (fdb_iterator **)0x11bbf8;
    fVar2 = fdb_iterator_prev(pfStack_39e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bdd0;
    pfStack_39e0 = (fdb_doc *)0x0;
    ppfStack_3a00 = (fdb_iterator **)0x11bc16;
    fVar2 = fdb_iterator_get(pfStack_39e8,&pfStack_39e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bdd5;
    ppfStack_3a00 = (fdb_iterator **)0x11bc36;
    sprintf((char *)apfStack_39b8,"k%06d\n",0);
    if (*pfStack_39e0->key != CONCAT62(apfStack_39b8[0]._2_6_,apfStack_39b8[0]._0_2_))
    goto LAB_0011bdda;
    ppfStack_3a00 = (fdb_iterator **)0x11bc50;
    fdb_doc_free(pfStack_39e0);
    ppfVar6 = &pfStack_39e8;
    ppfStack_3a00 = (fdb_iterator **)0x11bc5d;
    fdb_iterator_close(pfStack_39e8);
    ppfStack_3a00 = (fdb_iterator **)0x11bc89;
    fVar2 = fdb_iterator_init(pfStack_39d8,ppfVar6,apfStack_39b8,1,acStack_3898,1,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bde4;
    ppfStack_3a00 = (fdb_iterator **)0x11bc9b;
    fVar2 = fdb_iterator_seek_to_min(pfStack_39e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bde9;
    pfStack_39e0 = (fdb_doc *)0x0;
    ppfStack_3a00 = (fdb_iterator **)0x11bcb9;
    fVar2 = fdb_iterator_get(pfStack_39e8,&pfStack_39e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bdee;
    ppfVar6 = apfStack_39b8;
    ppfStack_3a00 = (fdb_iterator **)0x11bcd9;
    sprintf((char *)ppfVar6,"k%06d\n",0);
    if (*pfStack_39e0->key != CONCAT62(apfStack_39b8[0]._2_6_,apfStack_39b8[0]._0_2_))
    goto LAB_0011bdf3;
    ppfStack_3a00 = (fdb_iterator **)0x11bcf3;
    fdb_doc_free(pfStack_39e0);
    ppfStack_3a00 = (fdb_iterator **)0x11bcfd;
    fVar2 = fdb_iterator_next(pfStack_39e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bdfd;
    pfStack_39e0 = (fdb_doc *)0x0;
    ppfStack_3a00 = (fdb_iterator **)0x11bd1b;
    fVar2 = fdb_iterator_get(pfStack_39e8,&pfStack_39e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011be02;
    ppfVar6 = apfStack_39b8;
    ppfStack_3a00 = (fdb_iterator **)0x11bd3e;
    sprintf((char *)ppfVar6,"k%06d\n",2);
    if (*pfStack_39e0->key == CONCAT62(apfStack_39b8[0]._2_6_,apfStack_39b8[0]._0_2_)) {
      ppfStack_3a00 = (fdb_iterator **)0x11bd58;
      fdb_doc_free(pfStack_39e0);
      ppfStack_3a00 = (fdb_iterator **)0x11bd62;
      fdb_iterator_close(pfStack_39e8);
      ppfStack_3a00 = (fdb_iterator **)0x11bd6c;
      fdb_close(pfStack_39d0);
      ppfStack_3a00 = (fdb_iterator **)0x11bd71;
      fdb_shutdown();
      ppfStack_3a00 = (fdb_iterator **)0x11bd76;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (iterator_deleted_doc_right_before_the_end_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      ppfStack_3a00 = (fdb_iterator **)0x11bda7;
      fprintf(_stderr,pcVar17,"iterator deleted doc right before the end of iteration test");
      return;
    }
  }
  else {
    ppfStack_3a00 = (fdb_iterator **)0x11bdbc;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdbc:
    ppfStack_3a00 = (fdb_iterator **)0x11bdc1;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdc1:
    ppfStack_3a00 = (fdb_iterator **)0x11bdc6;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdc6:
    ppfStack_3a00 = (fdb_iterator **)0x11bdd0;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdd0:
    ppfStack_3a00 = (fdb_iterator **)0x11bdd5;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdd5:
    ppfStack_3a00 = (fdb_iterator **)0x11bdda;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdda:
    ppfVar6 = apfStack_39b8;
    ppfStack_3a00 = (fdb_iterator **)0x11bde4;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bde4:
    ppfStack_3a00 = (fdb_iterator **)0x11bde9;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bde9:
    ppfStack_3a00 = (fdb_iterator **)0x11bdee;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdee:
    ppfStack_3a00 = (fdb_iterator **)0x11bdf3;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdf3:
    ppfStack_3a00 = (fdb_iterator **)0x11bdfd;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdfd:
    ppfStack_3a00 = (fdb_iterator **)0x11be02;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011be02:
    ppfStack_3a00 = (fdb_iterator **)0x11be07;
    iterator_deleted_doc_right_before_the_end_test();
  }
  ppfStack_3a00 = (fdb_iterator **)iterator_uncommited_seeks;
  iterator_deleted_doc_right_before_the_end_test();
  pcStack_3b58 = (code *)0x11be25;
  ppfStack_3a00 = ppfVar6;
  gettimeofday(&tStack_3b08,(__timezone_ptr_t)0x0);
  pfStack_3b40 = (fdb_doc *)0x0;
  pcStack_3b58 = (code *)0x11be33;
  memleak_start();
  pfVar14 = &fStack_3af8;
  pcStack_3b58 = (code *)0x11be40;
  fdb_get_default_config();
  pcStack_3b58 = (code *)0x11be4a;
  fdb_get_default_kvs_config();
  pcStack_3b58 = (code *)0x11be56;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_3b58 = (code *)0x11be6a;
  fVar2 = fdb_open(&pfStack_3b28,"./iterator_test1",pfVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_3b58 = (code *)0x11be86;
    fVar2 = fdb_kvs_open_default(pfStack_3b28,&pfStack_3b30,&fStack_3b20);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c091;
    pcStack_3b58 = (code *)0x11bea9;
    fdb_set_kv(pfStack_3b30,"a",1,(void *)0x0,0);
    pfVar14 = (fdb_config *)0x155b95;
    pcStack_3b58 = (code *)0x11bec7;
    fdb_set_kv(pfStack_3b30,"b",1,(void *)0x0,0);
    pcStack_3b58 = (code *)0x11bee2;
    fdb_set_kv(pfStack_3b30,"c",1,(void *)0x0,0);
    pcStack_3b58 = (code *)0x11bf06;
    fVar2 = fdb_iterator_init(pfStack_3b30,&pfStack_3b38,"b",1,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c098;
    pcStack_3b58 = (code *)0x11bf18;
    fVar2 = fdb_iterator_seek_to_min(pfStack_3b38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c09d;
    pcStack_3b58 = (code *)0x11bf2f;
    fVar2 = fdb_iterator_get(pfStack_3b38,&pfStack_3b40);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0a4;
    if (*pfStack_3b40->key != 'b') goto LAB_0011c0ab;
    pcStack_3b58 = (code *)0x11bf4e;
    fdb_doc_free(pfStack_3b40);
    pfStack_3b40 = (fdb_doc *)0x0;
    pcStack_3b58 = (code *)0x11bf61;
    fVar2 = fdb_iterator_seek_to_max(pfStack_3b38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0b3;
    pcStack_3b58 = (code *)0x11bf78;
    fVar2 = fdb_iterator_get(pfStack_3b38,&pfStack_3b40);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0ba;
    if (*pfStack_3b40->key != 'c') goto LAB_0011c0c1;
    pcStack_3b58 = (code *)0x11bf97;
    fdb_doc_free(pfStack_3b40);
    pfStack_3b40 = (fdb_doc *)0x0;
    pcStack_3b58 = (code *)0x11bfaa;
    fVar2 = fdb_iterator_prev(pfStack_3b38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0c9;
    pcStack_3b58 = (code *)0x11bfc1;
    fVar2 = fdb_iterator_get(pfStack_3b38,&pfStack_3b40);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0d0;
    if (*pfStack_3b40->key != 'b') goto LAB_0011c0d7;
    pcStack_3b58 = (code *)0x11bfe0;
    fdb_doc_free(pfStack_3b40);
    pfStack_3b40 = (fdb_doc *)0x0;
    pcStack_3b58 = (code *)0x11bff3;
    fVar2 = fdb_iterator_next(pfStack_3b38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
    pcStack_3b58 = (code *)0x11c00a;
    fVar2 = fdb_iterator_get(pfStack_3b38,&pfStack_3b40);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e6;
    if (*pfStack_3b40->key == 'c') {
      pcStack_3b58 = (code *)0x11c029;
      fdb_doc_free(pfStack_3b40);
      pfStack_3b40 = (fdb_doc *)0x0;
      pcStack_3b58 = (code *)0x11c03c;
      fdb_iterator_close(pfStack_3b38);
      pcStack_3b58 = (code *)0x11c046;
      fdb_close(pfStack_3b28);
      pcStack_3b58 = (code *)0x11c04b;
      fdb_shutdown();
      pcStack_3b58 = (code *)0x11c050;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (iterator_uncommited_seeks()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pcStack_3b58 = (code *)0x11c081;
      fprintf(_stderr,pcVar17,"iterator single doc range");
      return;
    }
  }
  else {
    pcStack_3b58 = (code *)0x11c091;
    iterator_uncommited_seeks();
LAB_0011c091:
    pcStack_3b58 = (code *)0x11c098;
    iterator_uncommited_seeks();
LAB_0011c098:
    pcStack_3b58 = (code *)0x11c09d;
    iterator_uncommited_seeks();
LAB_0011c09d:
    pcStack_3b58 = (code *)0x11c0a4;
    iterator_uncommited_seeks();
LAB_0011c0a4:
    pcStack_3b58 = (code *)0x11c0ab;
    iterator_uncommited_seeks();
LAB_0011c0ab:
    pcStack_3b58 = (code *)0x11c0b3;
    iterator_uncommited_seeks();
LAB_0011c0b3:
    pcStack_3b58 = (code *)0x11c0ba;
    iterator_uncommited_seeks();
LAB_0011c0ba:
    pcStack_3b58 = (code *)0x11c0c1;
    iterator_uncommited_seeks();
LAB_0011c0c1:
    pcStack_3b58 = (code *)0x11c0c9;
    iterator_uncommited_seeks();
LAB_0011c0c9:
    pcStack_3b58 = (code *)0x11c0d0;
    iterator_uncommited_seeks();
LAB_0011c0d0:
    pcStack_3b58 = (code *)0x11c0d7;
    iterator_uncommited_seeks();
LAB_0011c0d7:
    pcStack_3b58 = (code *)0x11c0df;
    iterator_uncommited_seeks();
LAB_0011c0df:
    pcStack_3b58 = (code *)0x11c0e6;
    iterator_uncommited_seeks();
LAB_0011c0e6:
    pcStack_3b58 = (code *)0x11c0ed;
    iterator_uncommited_seeks();
  }
  pcStack_3b58 = iterator_init_using_substring_test;
  iterator_uncommited_seeks();
  pfStack_3f00 = (fdb_config *)0x11c10f;
  pfStack_3b68 = pfVar14;
  pcStack_3b60 = (char *)apfStack_39b8;
  pcStack_3b58 = (code *)uVar11;
  gettimeofday(&tStack_3e78,(__timezone_ptr_t)0x0);
  pfStack_3f00 = (fdb_config *)0x11c114;
  memleak_start();
  pfVar14 = &fStack_3d60;
  pfStack_3f00 = (fdb_config *)0x11c124;
  fdb_get_default_config();
  fStack_3d60.buffercache_size = 0;
  pfStack_3f00 = (fdb_config *)0x11c136;
  fdb_get_default_kvs_config();
  pfStack_3f00 = (fdb_config *)0x11c156;
  sprintf(acStack_3c68,"rm -rf  %s*","./iterator_test");
  pfStack_3f00 = (fdb_config *)0x11c15e;
  system(acStack_3c68);
  pfStack_3f00 = (fdb_config *)0x11c172;
  fVar2 = fdb_open(&pfStack_3ed8,"./iterator_test1",pfVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_3f00 = (fdb_config *)0x11c190;
    fVar2 = fdb_kvs_open(pfStack_3ed8,&pfStack_3ee0,(char *)0x0,&fStack_3e90);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c32a;
    uStack_3ea0 = 0x34323634353773;
    uStack_3e99 = 0xff;
    uStack_3eb8 = 0x34323634353773;
    uStack_3eb1 = 0x10000ff;
    uStack_3ea8._0_4_ = 0x34353773;
    uStack_3ea8._4_1_ = true;
    uStack_3ea8._5_1_ = true;
    uStack_3ea8._6_1_ = '4';
    uStack_3ea8._7_1_ = 0xff;
    uStack_3ec8 = 0xff34323634353773;
    uStack_3ec0 = 0xff;
    uStack_3e68 = 0x3179656b;
    uStack_3e64 = 0;
    pfStack_3f00 = (fdb_config *)0x11c1f4;
    fVar2 = fdb_set_kv(pfStack_3ee0,&uStack_3ea0,0xb,&uStack_3e68,4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c32f;
    uStack_3e64 = 0;
    uStack_3e68 = 0x3279656b;
    pfStack_3f00 = (fdb_config *)0x11c228;
    fVar2 = fdb_set_kv(pfStack_3ee0,&uStack_3eb8,0xb,&uStack_3e68,4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c334;
    pfStack_3f00 = (fdb_config *)0x11c23f;
    fVar2 = fdb_commit(pfStack_3ed8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c339;
    pfStack_3f00 = (fdb_config *)0x11c272;
    fVar2 = fdb_iterator_init(pfStack_3ee0,&pfStack_3ee8,&uStack_3ea8,8,&uStack_3ec8,9,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c33e;
    iVar3 = 0;
    pfVar14 = (fdb_config *)&pfStack_3ed0;
    do {
      pfStack_3ed0 = (fdb_doc *)0x0;
      pfStack_3f00 = (fdb_config *)0x11c297;
      fVar2 = fdb_iterator_get(pfStack_3ee8,(fdb_doc **)pfVar14);
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      iVar3 = iVar3 + 1;
      pfStack_3f00 = (fdb_config *)0x11c2a7;
      fdb_doc_free(pfStack_3ed0);
      pfStack_3f00 = (fdb_config *)0x11c2b1;
      fVar2 = fdb_iterator_next(pfStack_3ee8);
    } while (fVar2 == FDB_RESULT_SUCCESS);
    if (iVar3 != 2) goto LAB_0011c343;
    pfStack_3f00 = (fdb_config *)0x11c2c8;
    fVar2 = fdb_iterator_close(pfStack_3ee8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c348;
    pfStack_3f00 = (fdb_config *)0x11c2d6;
    fVar2 = fdb_close(pfStack_3ed8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c34d;
    pfStack_3f00 = (fdb_config *)0x11c2df;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_3f00 = (fdb_config *)0x11c2e8;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (iterator_init_using_substring_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_3f00 = (fdb_config *)0x11c319;
      fprintf(_stderr,pcVar17,"iterator init using substring test");
      return;
    }
  }
  else {
    pfStack_3f00 = (fdb_config *)0x11c32a;
    iterator_init_using_substring_test();
LAB_0011c32a:
    pfStack_3f00 = (fdb_config *)0x11c32f;
    iterator_init_using_substring_test();
LAB_0011c32f:
    pfStack_3f00 = (fdb_config *)0x11c334;
    iterator_init_using_substring_test();
LAB_0011c334:
    pfStack_3f00 = (fdb_config *)0x11c339;
    iterator_init_using_substring_test();
LAB_0011c339:
    pfStack_3f00 = (fdb_config *)0x11c33e;
    iterator_init_using_substring_test();
LAB_0011c33e:
    pfStack_3f00 = (fdb_config *)0x11c343;
    iterator_init_using_substring_test();
LAB_0011c343:
    pfStack_3f00 = (fdb_config *)0x11c348;
    iterator_init_using_substring_test();
LAB_0011c348:
    pfStack_3f00 = (fdb_config *)0x11c34d;
    iterator_init_using_substring_test();
LAB_0011c34d:
    pfStack_3f00 = (fdb_config *)0x11c352;
    iterator_init_using_substring_test();
  }
  pfStack_3f00 = (fdb_config *)iterator_seek_to_max_key_with_deletes_test;
  iterator_init_using_substring_test();
  pfStack_4058 = (fdb_config *)0x11c36d;
  pfStack_3f00 = pfVar14;
  gettimeofday(&tStack_4008,(__timezone_ptr_t)0x0);
  pfStack_4058 = (fdb_config *)0x11c372;
  memleak_start();
  pfStack_4040 = (fdb_iterator *)0x0;
  pfStack_4030 = (fdb_doc *)0x0;
  pfVar14 = &fStack_3ff8;
  pfStack_4058 = (fdb_config *)0x11c389;
  fdb_get_default_config();
  pfStack_4058 = (fdb_config *)0x11c393;
  fdb_get_default_kvs_config();
  pfStack_4058 = (fdb_config *)0x11c39f;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_4058 = (fdb_config *)0x11c3b3;
  fVar2 = fdb_open(&pfStack_4028,"./iterator_test1",pfVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_4058 = (fdb_config *)0x11c3cf;
    fVar2 = fdb_kvs_open_default(pfStack_4028,&pfStack_4038,&fStack_4020);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c58c;
    pfStack_4058 = (fdb_config *)0x11c3f2;
    fdb_set_kv(pfStack_4038,"A",1,(void *)0x0,0);
    pfVar14 = (fdb_config *)0x155dcc;
    pfStack_4058 = (fdb_config *)0x11c410;
    fdb_set_kv(pfStack_4038,"B",1,(void *)0x0,0);
    pfStack_4058 = (fdb_config *)0x11c43b;
    fVar2 = fdb_iterator_init(pfStack_4038,&pfStack_4040,"B",1,"Bzz",3,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c593;
    pfStack_4058 = (fdb_config *)0x11c44d;
    fVar2 = fdb_iterator_seek_to_max(pfStack_4040);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c598;
    pfStack_4058 = (fdb_config *)0x11c464;
    fVar2 = fdb_iterator_get(pfStack_4040,&pfStack_4030);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c59f;
    if (*pfStack_4030->key != 'B') goto LAB_0011c5a6;
    pfStack_4058 = (fdb_config *)0x11c483;
    fdb_doc_free(pfStack_4030);
    pfStack_4030 = (fdb_doc *)0x0;
    pfStack_4058 = (fdb_config *)0x11c496;
    fVar2 = fdb_iterator_close(pfStack_4040);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c5ae;
    pfStack_4040 = (fdb_iterator *)0x0;
    pfStack_4058 = (fdb_config *)0x11c4bd;
    fVar2 = fdb_del_kv(pfStack_4038,"B",1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c5b5;
    pfStack_4058 = (fdb_config *)0x11c4f4;
    fVar2 = fdb_iterator_init(pfStack_4038,&pfStack_4040,"B",1,"Bzz",3,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c5bc;
    pfStack_4058 = (fdb_config *)0x11c50b;
    fVar2 = fdb_iterator_get(pfStack_4040,&pfStack_4030);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c1;
    pfStack_4058 = (fdb_config *)0x11c51e;
    fVar2 = fdb_iterator_seek_to_max(pfStack_4040);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c6;
    pfStack_4058 = (fdb_config *)0x11c531;
    fVar2 = fdb_close(pfStack_4028);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c5cb;
    pfStack_4058 = (fdb_config *)0x11c53e;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_4058 = (fdb_config *)0x11c54b;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (iterator_seek_to_max_key_with_deletes_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_4058 = (fdb_config *)0x11c57c;
      fprintf(_stderr,pcVar17,"iterator seek to max test");
      return;
    }
  }
  else {
    pfStack_4058 = (fdb_config *)0x11c58c;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c58c:
    pfStack_4058 = (fdb_config *)0x11c593;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c593:
    pfStack_4058 = (fdb_config *)0x11c598;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c598:
    pfStack_4058 = (fdb_config *)0x11c59f;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c59f:
    pfStack_4058 = (fdb_config *)0x11c5a6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5a6:
    pfStack_4058 = (fdb_config *)0x11c5ae;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5ae:
    pfStack_4058 = (fdb_config *)0x11c5b5;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5b5:
    pfStack_4058 = (fdb_config *)0x11c5bc;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5bc:
    pfStack_4058 = (fdb_config *)0x11c5c1;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c1:
    pfStack_4058 = (fdb_config *)0x11c5c6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c6:
    pfStack_4058 = (fdb_config *)0x11c5cb;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5cb:
    pfStack_4058 = (fdb_config *)0x11c5d2;
    iterator_seek_to_max_key_with_deletes_test();
  }
  pfStack_4058 = (fdb_config *)iterator_seek_to_min_key_with_deletes_test;
  iterator_seek_to_max_key_with_deletes_test();
  pfStack_4058 = pfVar14;
  gettimeofday(&tStack_4160,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_4198 = (fdb_iterator *)0x0;
  pfStack_4180 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar2 = fdb_open(&pfStack_4188,"./iterator_test1",&fStack_4150);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open_default(pfStack_4188,&pfStack_4190,&fStack_4178);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c779;
    fdb_set_kv(pfStack_4190,"B",1,(void *)0x0,0);
    fdb_set_kv(pfStack_4190,"C",1,(void *)0x0,0);
    fVar2 = fdb_del_kv(pfStack_4190,"B",1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c780;
    fVar2 = fdb_iterator_init(pfStack_4190,&pfStack_4198,"A",1,"B",1,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c787;
    fVar2 = fdb_iterator_get(pfStack_4198,&pfStack_4180);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c78c;
    fVar2 = fdb_iterator_seek_to_min(pfStack_4198);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c791;
    fVar2 = fdb_iterator_close(pfStack_4198);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c796;
    fVar2 = fdb_close(pfStack_4188);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_shutdown();
      if (fVar2 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar17 = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          pcVar17 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar17,"iterator seek to min test");
        return;
      }
      goto LAB_0011c7a4;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c779:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c780:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c787:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c78c:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c791:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c796:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c7a4:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  iVar3 = 0;
  do {
    delete_opt = 0;
    do {
      iterator_complete_test(iVar3,delete_opt);
      delete_opt = delete_opt + 1;
    } while (delete_opt == 1);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void iterator_seek_wal_only_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "iterator_seek_wal_only_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another KV store..
    status = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert using 'kv1' instance to ensure it does not interfere
    for (i=0;i<n;++i){
        sprintf(keybuf, "kEy%d", i);
        sprintf(metabuf, "mEta%d", i);
        sprintf(bodybuf, "bOdy%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(kv1, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc[i]);
    }

    // insert all documents into WAL only
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator for full range
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // seek current iterator to inside the WAL's avl tree..
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[0]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[0]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[0]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to 2nd key ..
    i=2;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // iterator should be able to proceed forward
    status = fdb_iterator_next(iterator);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i++;
    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to the last key.
    status = fdb_iterator_seek(iterator, doc[n-1]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[n-1]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[n-1]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[n-1]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek backward to start key ..
    i = 0;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to key2 ..
    status = fdb_iterator_seek(iterator, doc[2]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=2;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    // Seek backward again to a key...
    status = fdb_iterator_seek(iterator, doc[3]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=3;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    fdb_iterator_close(iterator);

    // Test fdb_iterator_seek_to_max with key range
    // create an iterator for range of doc[4] ~ doc[8]
    sprintf(keybuf, "key%d", 4); // reuse buffer for start key
    sprintf(metabuf, "key%d", 8); // reuse buffer for end_key
    status = fdb_iterator_init(db, &iterator, keybuf, strlen(keybuf),
                      metabuf, strlen(metabuf),
                      FDB_ITR_NO_DELETES);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 8;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 4;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Test fdb_iterator_seek_to_max over full range
    status = fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i = n - 1;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 0;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close the kvs kv1
    fdb_kvs_close(kv1);
    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("iterator seek wal only test");
}